

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersectorK<4,16>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  uint uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  bool bVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  byte bVar24;
  uint uVar25;
  ulong uVar27;
  uint uVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  ulong uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [64];
  undefined1 auVar85 [64];
  undefined1 auVar87 [64];
  undefined1 auVar89 [64];
  undefined1 auVar91 [64];
  undefined1 auVar93 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  float fVar98;
  float fVar106;
  vint4 bi_2;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [64];
  undefined4 uVar107;
  vint4 bi_1;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar123;
  vint4 bi;
  undefined1 auVar114 [16];
  float fVar124;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar134;
  float fVar139;
  float fVar140;
  vint4 ai_2;
  float fVar141;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  vint4 ai;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  vint4 ai_1;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar176;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  vfloat4 a0_3;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  vfloat4 a0_2;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  float fVar201;
  float fVar202;
  float fVar212;
  float fVar214;
  float fVar216;
  undefined1 auVar203 [16];
  float fVar213;
  float fVar215;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar217;
  float fVar218;
  float fVar226;
  float fVar227;
  float fVar228;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  vfloat4 a0;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  vfloat4 a0_1;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 in_ZMM29 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  float local_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  uint auStack_620 [4];
  RTCFilterFunctionNArguments local_610;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 local_590 [8];
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 local_570 [16];
  undefined1 local_560 [16];
  undefined1 local_550 [8];
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [16];
  undefined1 local_530 [8];
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined8 uStack_460;
  undefined1 local_440 [64];
  undefined4 local_3e0;
  undefined4 uStack_3dc;
  undefined4 uStack_3d8;
  undefined4 uStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined1 local_3c0 [32];
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar26;
  undefined1 auVar84 [64];
  undefined1 auVar86 [64];
  undefined1 auVar88 [64];
  undefined1 auVar90 [64];
  undefined1 auVar92 [64];
  undefined1 auVar94 [64];
  
  PVar3 = prim[1];
  uVar27 = (ulong)(byte)PVar3;
  fVar98 = *(float *)(prim + uVar27 * 0x19 + 0x12);
  auVar36 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar36 = vinsertps_avx(auVar36,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar37 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar37 = vinsertps_avx(auVar37,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar36 = vsubps_avx(auVar36,*(undefined1 (*) [16])(prim + uVar27 * 0x19 + 6));
  auVar54._0_4_ = fVar98 * auVar36._0_4_;
  auVar54._4_4_ = fVar98 * auVar36._4_4_;
  auVar54._8_4_ = fVar98 * auVar36._8_4_;
  auVar54._12_4_ = fVar98 * auVar36._12_4_;
  auVar43._0_4_ = fVar98 * auVar37._0_4_;
  auVar43._4_4_ = fVar98 * auVar37._4_4_;
  auVar43._8_4_ = fVar98 * auVar37._8_4_;
  auVar43._12_4_ = fVar98 * auVar37._12_4_;
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar27 * 4 + 6)));
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar27 * 5 + 6)));
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar27 * 6 + 6)));
  auVar49 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar27 * 0xb + 6)));
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar49 = vcvtdq2ps_avx(auVar49);
  auVar48 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar48 = vcvtdq2ps_avx(auVar48);
  auVar47 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar27 + 6)));
  auVar47 = vcvtdq2ps_avx(auVar47);
  uVar35 = (ulong)(uint)((int)(uVar27 * 9) * 2);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar35 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar46 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar35 + uVar27 + 6)));
  auVar46 = vcvtdq2ps_avx(auVar46);
  uVar20 = (ulong)(uint)((int)(uVar27 * 5) << 2);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar20 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar58._4_4_ = auVar43._0_4_;
  auVar58._0_4_ = auVar43._0_4_;
  auVar58._8_4_ = auVar43._0_4_;
  auVar58._12_4_ = auVar43._0_4_;
  auVar41 = vshufps_avx(auVar43,auVar43,0x55);
  auVar39 = vshufps_avx(auVar43,auVar43,0xaa);
  fVar98 = auVar39._0_4_;
  auVar61._0_4_ = fVar98 * auVar38._0_4_;
  fVar106 = auVar39._4_4_;
  auVar61._4_4_ = fVar106 * auVar38._4_4_;
  fVar217 = auVar39._8_4_;
  auVar61._8_4_ = fVar217 * auVar38._8_4_;
  fVar202 = auVar39._12_4_;
  auVar61._12_4_ = fVar202 * auVar38._12_4_;
  auVar50._0_4_ = auVar47._0_4_ * fVar98;
  auVar50._4_4_ = auVar47._4_4_ * fVar106;
  auVar50._8_4_ = auVar47._8_4_ * fVar217;
  auVar50._12_4_ = auVar47._12_4_ * fVar202;
  auVar44._0_4_ = auVar10._0_4_ * fVar98;
  auVar44._4_4_ = auVar10._4_4_ * fVar106;
  auVar44._8_4_ = auVar10._8_4_ * fVar217;
  auVar44._12_4_ = auVar10._12_4_ * fVar202;
  auVar39 = vfmadd231ps_fma(auVar61,auVar41,auVar37);
  auVar40 = vfmadd231ps_fma(auVar50,auVar41,auVar48);
  auVar41 = vfmadd231ps_fma(auVar44,auVar46,auVar41);
  auVar42 = vfmadd231ps_fma(auVar39,auVar58,auVar36);
  auVar40 = vfmadd231ps_fma(auVar40,auVar58,auVar49);
  auVar43 = vfmadd231ps_fma(auVar41,auVar9,auVar58);
  auVar59._4_4_ = auVar54._0_4_;
  auVar59._0_4_ = auVar54._0_4_;
  auVar59._8_4_ = auVar54._0_4_;
  auVar59._12_4_ = auVar54._0_4_;
  auVar41 = vshufps_avx(auVar54,auVar54,0x55);
  auVar39 = vshufps_avx(auVar54,auVar54,0xaa);
  fVar98 = auVar39._0_4_;
  auVar237._0_4_ = fVar98 * auVar38._0_4_;
  fVar106 = auVar39._4_4_;
  auVar237._4_4_ = fVar106 * auVar38._4_4_;
  fVar217 = auVar39._8_4_;
  auVar237._8_4_ = fVar217 * auVar38._8_4_;
  fVar202 = auVar39._12_4_;
  auVar237._12_4_ = fVar202 * auVar38._12_4_;
  auVar55._0_4_ = auVar47._0_4_ * fVar98;
  auVar55._4_4_ = auVar47._4_4_ * fVar106;
  auVar55._8_4_ = auVar47._8_4_ * fVar217;
  auVar55._12_4_ = auVar47._12_4_ * fVar202;
  auVar56._0_4_ = auVar10._0_4_ * fVar98;
  auVar56._4_4_ = auVar10._4_4_ * fVar106;
  auVar56._8_4_ = auVar10._8_4_ * fVar217;
  auVar56._12_4_ = auVar10._12_4_ * fVar202;
  auVar37 = vfmadd231ps_fma(auVar237,auVar41,auVar37);
  auVar38 = vfmadd231ps_fma(auVar55,auVar41,auVar48);
  auVar48 = vfmadd231ps_fma(auVar56,auVar41,auVar46);
  auVar47 = vfmadd231ps_fma(auVar37,auVar59,auVar36);
  auVar46 = vfmadd231ps_fma(auVar38,auVar59,auVar49);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar245 = ZEXT1664(auVar36);
  auVar10 = vfmadd231ps_fma(auVar48,auVar59,auVar9);
  auVar37 = vandps_avx512vl(auVar42,auVar36);
  auVar51._8_4_ = 0x219392ef;
  auVar51._0_8_ = 0x219392ef219392ef;
  auVar51._12_4_ = 0x219392ef;
  uVar35 = vcmpps_avx512vl(auVar37,auVar51,1);
  bVar29 = (bool)((byte)uVar35 & 1);
  auVar39._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar42._0_4_;
  bVar29 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar39._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar42._4_4_;
  bVar29 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar39._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar42._8_4_;
  bVar29 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar39._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar42._12_4_;
  auVar37 = vandps_avx512vl(auVar40,auVar36);
  uVar35 = vcmpps_avx512vl(auVar37,auVar51,1);
  bVar29 = (bool)((byte)uVar35 & 1);
  auVar42._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar40._0_4_;
  bVar29 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar42._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar40._4_4_;
  bVar29 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar42._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar40._8_4_;
  bVar29 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar42._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar40._12_4_;
  auVar36 = vandps_avx512vl(auVar43,auVar36);
  uVar35 = vcmpps_avx512vl(auVar36,auVar51,1);
  bVar29 = (bool)((byte)uVar35 & 1);
  auVar40._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar43._0_4_;
  bVar29 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar40._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar43._4_4_;
  bVar29 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar40._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar43._8_4_;
  bVar29 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar40._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar43._12_4_;
  auVar36 = vrcp14ps_avx512vl(auVar39);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar246 = ZEXT1664(auVar37);
  auVar38 = vfnmadd213ps_avx512vl(auVar39,auVar36,auVar37);
  auVar49 = vfmadd132ps_fma(auVar38,auVar36,auVar36);
  auVar36 = vrcp14ps_avx512vl(auVar42);
  auVar38 = vfnmadd213ps_avx512vl(auVar42,auVar36,auVar37);
  auVar48 = vfmadd132ps_fma(auVar38,auVar36,auVar36);
  auVar36 = vrcp14ps_avx512vl(auVar40);
  auVar37 = vfnmadd213ps_avx512vl(auVar40,auVar36,auVar37);
  auVar9 = vfmadd132ps_fma(auVar37,auVar36,auVar36);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar27 * 7 + 6);
  auVar36 = vpmovsxwd_avx(auVar36);
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar36 = vsubps_avx(auVar36,auVar47);
  auVar142._0_4_ = auVar49._0_4_ * auVar36._0_4_;
  auVar142._4_4_ = auVar49._4_4_ * auVar36._4_4_;
  auVar142._8_4_ = auVar49._8_4_ * auVar36._8_4_;
  auVar142._12_4_ = auVar49._12_4_ * auVar36._12_4_;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar27 * 9 + 6);
  auVar36 = vpmovsxwd_avx(auVar37);
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar36 = vsubps_avx(auVar36,auVar47);
  auVar39 = vpbroadcastd_avx512vl();
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar37 = vpmovsxwd_avx(auVar38);
  auVar53._0_4_ = auVar49._0_4_ * auVar36._0_4_;
  auVar53._4_4_ = auVar49._4_4_ * auVar36._4_4_;
  auVar53._8_4_ = auVar49._8_4_ * auVar36._8_4_;
  auVar53._12_4_ = auVar49._12_4_ * auVar36._12_4_;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar27 * -2 + 6);
  auVar36 = vpmovsxwd_avx(auVar49);
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar36 = vsubps_avx(auVar36,auVar46);
  auVar52._0_4_ = auVar48._0_4_ * auVar36._0_4_;
  auVar52._4_4_ = auVar48._4_4_ * auVar36._4_4_;
  auVar52._8_4_ = auVar48._8_4_ * auVar36._8_4_;
  auVar52._12_4_ = auVar48._12_4_ * auVar36._12_4_;
  auVar36 = vcvtdq2ps_avx(auVar37);
  auVar36 = vsubps_avx(auVar36,auVar46);
  auVar57._0_4_ = auVar48._0_4_ * auVar36._0_4_;
  auVar57._4_4_ = auVar48._4_4_ * auVar36._4_4_;
  auVar57._8_4_ = auVar48._8_4_ * auVar36._8_4_;
  auVar57._12_4_ = auVar48._12_4_ * auVar36._12_4_;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar20 + uVar27 + 6);
  auVar36 = vpmovsxwd_avx(auVar48);
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar36 = vsubps_avx(auVar36,auVar10);
  auVar60._0_4_ = auVar9._0_4_ * auVar36._0_4_;
  auVar60._4_4_ = auVar9._4_4_ * auVar36._4_4_;
  auVar60._8_4_ = auVar9._8_4_ * auVar36._8_4_;
  auVar60._12_4_ = auVar9._12_4_ * auVar36._12_4_;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar27 * 0x17 + 6);
  auVar36 = vpmovsxwd_avx(auVar47);
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar36 = vsubps_avx(auVar36,auVar10);
  auVar45._0_4_ = auVar9._0_4_ * auVar36._0_4_;
  auVar45._4_4_ = auVar9._4_4_ * auVar36._4_4_;
  auVar45._8_4_ = auVar9._8_4_ * auVar36._8_4_;
  auVar45._12_4_ = auVar9._12_4_ * auVar36._12_4_;
  auVar36 = vpminsd_avx(auVar142,auVar53);
  auVar37 = vpminsd_avx(auVar52,auVar57);
  auVar36 = vmaxps_avx(auVar36,auVar37);
  auVar37 = vpminsd_avx(auVar60,auVar45);
  uVar107 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar9._4_4_ = uVar107;
  auVar9._0_4_ = uVar107;
  auVar9._8_4_ = uVar107;
  auVar9._12_4_ = uVar107;
  auVar37 = vmaxps_avx512vl(auVar37,auVar9);
  auVar36 = vmaxps_avx(auVar36,auVar37);
  auVar46._8_4_ = 0x3f7ffffa;
  auVar46._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar46._12_4_ = 0x3f7ffffa;
  local_5a0 = vmulps_avx512vl(auVar36,auVar46);
  auVar36 = vpmaxsd_avx(auVar142,auVar53);
  auVar37 = vpmaxsd_avx(auVar52,auVar57);
  auVar36 = vminps_avx(auVar36,auVar37);
  auVar37 = vpmaxsd_avx(auVar60,auVar45);
  uVar107 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar10._4_4_ = uVar107;
  auVar10._0_4_ = uVar107;
  auVar10._8_4_ = uVar107;
  auVar10._12_4_ = uVar107;
  auVar37 = vminps_avx512vl(auVar37,auVar10);
  auVar36 = vminps_avx(auVar36,auVar37);
  auVar41._8_4_ = 0x3f800003;
  auVar41._0_8_ = 0x3f8000033f800003;
  auVar41._12_4_ = 0x3f800003;
  auVar36 = vmulps_avx512vl(auVar36,auVar41);
  uVar11 = vcmpps_avx512vl(local_5a0,auVar36,2);
  uVar35 = vpcmpgtd_avx512vl(auVar39,_DAT_01f7fcf0);
  uVar35 = ((byte)uVar11 & 0xf) & uVar35;
  if ((char)uVar35 == '\0') {
    return false;
  }
  auVar105 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar105);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar249 = ZEXT1664(auVar36);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar105 = ZEXT1664(auVar36);
  auVar248 = ZEXT464(0x3f800000);
  auVar36 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
  auVar247 = ZEXT1664(auVar36);
LAB_01aea204:
  lVar23 = 0;
  for (uVar20 = uVar35; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
    lVar23 = lVar23 + 1;
  }
  uVar28 = *(uint *)(prim + 2);
  pGVar5 = (context->scene->geometries).items[uVar28].ptr;
  uVar20 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar23 * 4 + 6));
  p_Var6 = pGVar5[1].intersectionFilterN;
  pvVar7 = pGVar5[2].userPtr;
  _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar36 = *(undefined1 (*) [16])(_Var8 + uVar20 * (long)pvVar7);
  auVar37 = *(undefined1 (*) [16])(_Var8 + (uVar20 + 1) * (long)pvVar7);
  auVar38 = *(undefined1 (*) [16])(_Var8 + (uVar20 + 2) * (long)pvVar7);
  auVar49 = *(undefined1 (*) [16])(_Var8 + (long)pvVar7 * (uVar20 + 3));
  lVar23 = *(long *)&pGVar5[1].time_range.upper;
  auVar48 = *(undefined1 (*) [16])(lVar23 + (long)p_Var6 * uVar20);
  auVar47 = *(undefined1 (*) [16])(lVar23 + (long)p_Var6 * (uVar20 + 1));
  auVar9 = *(undefined1 (*) [16])(lVar23 + (long)p_Var6 * (uVar20 + 2));
  uVar35 = uVar35 - 1 & uVar35;
  auVar46 = *(undefined1 (*) [16])(lVar23 + (long)p_Var6 * (uVar20 + 3));
  if (uVar35 != 0) {
    uVar27 = uVar35 - 1 & uVar35;
    for (uVar20 = uVar35; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
    }
    if (uVar27 != 0) {
      for (; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar10 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar10 = vinsertps_avx(auVar10,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  auVar61 = auVar249._0_16_;
  auVar39 = vmulps_avx512vl(auVar46,auVar61);
  auVar41 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar9,auVar39);
  auVar108._0_4_ = auVar47._0_4_ + auVar41._0_4_;
  auVar108._4_4_ = auVar47._4_4_ + auVar41._4_4_;
  auVar108._8_4_ = auVar47._8_4_ + auVar41._8_4_;
  auVar108._12_4_ = auVar47._12_4_ + auVar41._12_4_;
  auVar40 = vfmadd231ps_avx512vl(auVar108,auVar48,auVar61);
  auVar50 = ZEXT816(0) << 0x40;
  auVar114._0_4_ = auVar46._0_4_ * 0.0;
  auVar114._4_4_ = auVar46._4_4_ * 0.0;
  auVar114._8_4_ = auVar46._8_4_ * 0.0;
  auVar114._12_4_ = auVar46._12_4_ * 0.0;
  auVar57 = auVar105._0_16_;
  auVar41 = vfmadd231ps_avx512vl(auVar114,auVar9,auVar57);
  auVar41 = vfmadd231ps_fma(auVar41,auVar47,auVar50);
  auVar42 = vfnmadd231ps_avx512vl(auVar41,auVar48,auVar57);
  auVar43 = vmulps_avx512vl(auVar49,auVar61);
  auVar41 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar38,auVar43);
  auVar229._0_4_ = auVar41._0_4_ + auVar37._0_4_;
  auVar229._4_4_ = auVar41._4_4_ + auVar37._4_4_;
  auVar229._8_4_ = auVar41._8_4_ + auVar37._8_4_;
  auVar229._12_4_ = auVar41._12_4_ + auVar37._12_4_;
  auVar44 = vfmadd231ps_avx512vl(auVar229,auVar36,auVar61);
  auVar233._0_4_ = auVar49._0_4_ * 0.0;
  auVar233._4_4_ = auVar49._4_4_ * 0.0;
  auVar233._8_4_ = auVar49._8_4_ * 0.0;
  auVar233._12_4_ = auVar49._12_4_ * 0.0;
  auVar41 = vfmadd231ps_avx512vl(auVar233,auVar38,auVar57);
  auVar41 = vfmadd231ps_fma(auVar41,auVar37,auVar50);
  auVar45 = vfnmadd231ps_avx512vl(auVar41,auVar36,auVar57);
  auVar125._0_4_ = auVar9._0_4_ + auVar39._0_4_;
  auVar125._4_4_ = auVar9._4_4_ + auVar39._4_4_;
  auVar125._8_4_ = auVar9._8_4_ + auVar39._8_4_;
  auVar125._12_4_ = auVar9._12_4_ + auVar39._12_4_;
  auVar41 = vfmadd231ps_fma(auVar125,auVar47,auVar50);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar48,auVar61);
  auVar46 = vmulps_avx512vl(auVar46,auVar57);
  auVar9 = vfmadd231ps_fma(auVar46,auVar50,auVar9);
  auVar47 = vfnmadd231ps_avx512vl(auVar9,auVar57,auVar47);
  auVar9 = vfmadd231ps_fma(auVar47,auVar50,auVar48);
  auVar183._0_4_ = auVar43._0_4_ + auVar38._0_4_;
  auVar183._4_4_ = auVar43._4_4_ + auVar38._4_4_;
  auVar183._8_4_ = auVar43._8_4_ + auVar38._8_4_;
  auVar183._12_4_ = auVar43._12_4_ + auVar38._12_4_;
  auVar48 = vfmadd231ps_fma(auVar183,auVar37,auVar50);
  auVar48 = vfmadd231ps_avx512vl(auVar48,auVar36,auVar61);
  auVar49 = vmulps_avx512vl(auVar49,auVar57);
  auVar38 = vfmadd231ps_fma(auVar49,auVar50,auVar38);
  auVar37 = vfnmadd231ps_avx512vl(auVar38,auVar57,auVar37);
  auVar47 = vfmadd231ps_fma(auVar37,auVar50,auVar36);
  auVar36 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar37 = vshufps_avx(auVar44,auVar44,0xc9);
  fVar213 = auVar42._0_4_;
  auVar152._0_4_ = fVar213 * auVar37._0_4_;
  fVar215 = auVar42._4_4_;
  auVar152._4_4_ = fVar215 * auVar37._4_4_;
  fVar123 = auVar42._8_4_;
  auVar152._8_4_ = fVar123 * auVar37._8_4_;
  fVar124 = auVar42._12_4_;
  auVar152._12_4_ = fVar124 * auVar37._12_4_;
  auVar37 = vfmsub231ps_fma(auVar152,auVar36,auVar44);
  auVar38 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar37 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar153._0_4_ = fVar213 * auVar37._0_4_;
  auVar153._4_4_ = fVar215 * auVar37._4_4_;
  auVar153._8_4_ = fVar123 * auVar37._8_4_;
  auVar153._12_4_ = fVar124 * auVar37._12_4_;
  auVar36 = vfmsub231ps_fma(auVar153,auVar36,auVar45);
  auVar49 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar36 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar37 = vshufps_avx(auVar48,auVar48,0xc9);
  fVar134 = auVar9._0_4_;
  auVar143._0_4_ = fVar134 * auVar37._0_4_;
  fVar139 = auVar9._4_4_;
  auVar143._4_4_ = fVar139 * auVar37._4_4_;
  fVar140 = auVar9._8_4_;
  auVar143._8_4_ = fVar140 * auVar37._8_4_;
  fVar141 = auVar9._12_4_;
  auVar143._12_4_ = fVar141 * auVar37._12_4_;
  auVar37 = vfmsub231ps_fma(auVar143,auVar36,auVar48);
  auVar48 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar37 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar184._0_4_ = auVar37._0_4_ * fVar134;
  auVar184._4_4_ = auVar37._4_4_ * fVar139;
  auVar184._8_4_ = auVar37._8_4_ * fVar140;
  auVar184._12_4_ = auVar37._12_4_ * fVar141;
  auVar36 = vfmsub231ps_fma(auVar184,auVar36,auVar47);
  auVar47 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar36 = vdpps_avx(auVar38,auVar38,0x7f);
  fVar106 = auVar36._0_4_;
  auVar185._4_12_ = ZEXT812(0) << 0x20;
  auVar185._0_4_ = fVar106;
  auVar37 = vrsqrt14ss_avx512f(auVar50,auVar185);
  auVar46 = vmulss_avx512f(auVar37,ZEXT416(0x3fc00000));
  auVar39 = vmulss_avx512f(auVar36,ZEXT416(0xbf000000));
  fVar98 = auVar37._0_4_;
  fVar98 = auVar46._0_4_ + auVar39._0_4_ * fVar98 * fVar98 * fVar98;
  fVar218 = fVar98 * auVar38._0_4_;
  fVar226 = fVar98 * auVar38._4_4_;
  fVar227 = fVar98 * auVar38._8_4_;
  fVar228 = fVar98 * auVar38._12_4_;
  auVar37 = vdpps_avx(auVar38,auVar49,0x7f);
  auVar196._0_4_ = auVar49._0_4_ * fVar106;
  auVar196._4_4_ = auVar49._4_4_ * fVar106;
  auVar196._8_4_ = auVar49._8_4_ * fVar106;
  auVar196._12_4_ = auVar49._12_4_ * fVar106;
  fVar106 = auVar37._0_4_;
  auVar163._0_4_ = fVar106 * auVar38._0_4_;
  auVar163._4_4_ = fVar106 * auVar38._4_4_;
  auVar163._8_4_ = fVar106 * auVar38._8_4_;
  auVar163._12_4_ = fVar106 * auVar38._12_4_;
  auVar38 = vsubps_avx(auVar196,auVar163);
  auVar37 = vrcp14ss_avx512f(auVar50,auVar185);
  auVar36 = vfnmadd213ss_avx512f(auVar36,auVar37,ZEXT416(0x40000000));
  fVar217 = auVar37._0_4_ * auVar36._0_4_;
  auVar36 = vdpps_avx(auVar48,auVar48,0x7f);
  fVar202 = auVar36._0_4_;
  auVar177._4_12_ = ZEXT812(0) << 0x20;
  auVar177._0_4_ = fVar202;
  auVar37 = vrsqrt14ss_avx512f(auVar50,auVar177);
  auVar49 = vmulss_avx512f(auVar37,ZEXT416(0x3fc00000));
  auVar46 = vmulss_avx512f(auVar36,ZEXT416(0xbf000000));
  fVar106 = auVar37._0_4_;
  fVar106 = auVar49._0_4_ + auVar46._0_4_ * fVar106 * fVar106 * fVar106;
  fVar201 = fVar106 * auVar48._0_4_;
  fVar212 = fVar106 * auVar48._4_4_;
  fVar214 = fVar106 * auVar48._8_4_;
  fVar216 = fVar106 * auVar48._12_4_;
  auVar37 = vdpps_avx(auVar48,auVar47,0x7f);
  auVar154._0_4_ = fVar202 * auVar47._0_4_;
  auVar154._4_4_ = fVar202 * auVar47._4_4_;
  auVar154._8_4_ = fVar202 * auVar47._8_4_;
  auVar154._12_4_ = fVar202 * auVar47._12_4_;
  fVar202 = auVar37._0_4_;
  auVar144._0_4_ = fVar202 * auVar48._0_4_;
  auVar144._4_4_ = fVar202 * auVar48._4_4_;
  auVar144._8_4_ = fVar202 * auVar48._8_4_;
  auVar144._12_4_ = fVar202 * auVar48._12_4_;
  auVar49 = vsubps_avx(auVar154,auVar144);
  auVar37 = vrcp14ss_avx512f(auVar50,auVar177);
  auVar36 = vfnmadd213ss_avx512f(auVar36,auVar37,ZEXT416(0x40000000));
  fVar202 = auVar36._0_4_ * auVar37._0_4_;
  auVar36 = vshufps_avx(auVar40,auVar40,0xff);
  auVar178._0_4_ = fVar218 * auVar36._0_4_;
  auVar178._4_4_ = fVar226 * auVar36._4_4_;
  auVar178._8_4_ = fVar227 * auVar36._8_4_;
  auVar178._12_4_ = fVar228 * auVar36._12_4_;
  local_520 = vsubps_avx(auVar40,auVar178);
  auVar37 = vshufps_avx(auVar42,auVar42,0xff);
  auVar155._0_4_ = auVar37._0_4_ * fVar218 + auVar36._0_4_ * fVar98 * fVar217 * auVar38._0_4_;
  auVar155._4_4_ = auVar37._4_4_ * fVar226 + auVar36._4_4_ * fVar98 * fVar217 * auVar38._4_4_;
  auVar155._8_4_ = auVar37._8_4_ * fVar227 + auVar36._8_4_ * fVar98 * fVar217 * auVar38._8_4_;
  auVar155._12_4_ = auVar37._12_4_ * fVar228 + auVar36._12_4_ * fVar98 * fVar217 * auVar38._12_4_;
  auVar38 = vsubps_avx(auVar42,auVar155);
  local_530._0_4_ = auVar178._0_4_ + auVar40._0_4_;
  local_530._4_4_ = auVar178._4_4_ + auVar40._4_4_;
  fStack_528 = auVar178._8_4_ + auVar40._8_4_;
  fStack_524 = auVar178._12_4_ + auVar40._12_4_;
  auVar36 = vshufps_avx(auVar41,auVar41,0xff);
  auVar156._0_4_ = fVar201 * auVar36._0_4_;
  auVar156._4_4_ = fVar212 * auVar36._4_4_;
  auVar156._8_4_ = fVar214 * auVar36._8_4_;
  auVar156._12_4_ = fVar216 * auVar36._12_4_;
  local_540 = vsubps_avx(auVar41,auVar156);
  auVar37 = vshufps_avx(auVar9,auVar9,0xff);
  auVar115._0_4_ = auVar37._0_4_ * fVar201 + auVar36._0_4_ * fVar106 * auVar49._0_4_ * fVar202;
  auVar115._4_4_ = auVar37._4_4_ * fVar212 + auVar36._4_4_ * fVar106 * auVar49._4_4_ * fVar202;
  auVar115._8_4_ = auVar37._8_4_ * fVar214 + auVar36._8_4_ * fVar106 * auVar49._8_4_ * fVar202;
  auVar115._12_4_ = auVar37._12_4_ * fVar216 + auVar36._12_4_ * fVar106 * auVar49._12_4_ * fVar202;
  auVar36 = vsubps_avx(auVar9,auVar115);
  _local_550 = vaddps_avx512vl(auVar41,auVar156);
  auVar126._0_4_ = auVar38._0_4_ * 0.33333334;
  auVar126._4_4_ = auVar38._4_4_ * 0.33333334;
  auVar126._8_4_ = auVar38._8_4_ * 0.33333334;
  auVar126._12_4_ = auVar38._12_4_ * 0.33333334;
  local_560 = vaddps_avx512vl(local_520,auVar126);
  auVar127._0_4_ = auVar36._0_4_ * 0.33333334;
  auVar127._4_4_ = auVar36._4_4_ * 0.33333334;
  auVar127._8_4_ = auVar36._8_4_ * 0.33333334;
  auVar127._12_4_ = auVar36._12_4_ * 0.33333334;
  local_570 = vsubps_avx512vl(local_540,auVar127);
  auVar109._0_4_ = (fVar213 + auVar155._0_4_) * 0.33333334;
  auVar109._4_4_ = (fVar215 + auVar155._4_4_) * 0.33333334;
  auVar109._8_4_ = (fVar123 + auVar155._8_4_) * 0.33333334;
  auVar109._12_4_ = (fVar124 + auVar155._12_4_) * 0.33333334;
  _local_580 = vaddps_avx512vl(_local_530,auVar109);
  auVar110._0_4_ = (fVar134 + auVar115._0_4_) * 0.33333334;
  auVar110._4_4_ = (fVar139 + auVar115._4_4_) * 0.33333334;
  auVar110._8_4_ = (fVar140 + auVar115._8_4_) * 0.33333334;
  auVar110._12_4_ = (fVar141 + auVar115._12_4_) * 0.33333334;
  _local_590 = vsubps_avx512vl(_local_550,auVar110);
  local_4a0 = vsubps_avx(local_520,auVar10);
  uVar107 = local_4a0._0_4_;
  auVar116._4_4_ = uVar107;
  auVar116._0_4_ = uVar107;
  auVar116._8_4_ = uVar107;
  auVar116._12_4_ = uVar107;
  auVar36 = vshufps_avx(local_4a0,local_4a0,0x55);
  auVar37 = vshufps_avx(local_4a0,local_4a0,0xaa);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar98 = pre->ray_space[k].vz.field_0.m128[0];
  fVar106 = pre->ray_space[k].vz.field_0.m128[1];
  fVar217 = pre->ray_space[k].vz.field_0.m128[2];
  fVar202 = pre->ray_space[k].vz.field_0.m128[3];
  auVar111._0_4_ = fVar98 * auVar37._0_4_;
  auVar111._4_4_ = fVar106 * auVar37._4_4_;
  auVar111._8_4_ = fVar217 * auVar37._8_4_;
  auVar111._12_4_ = fVar202 * auVar37._12_4_;
  auVar36 = vfmadd231ps_fma(auVar111,(undefined1  [16])aVar2,auVar36);
  auVar41 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar1,auVar116);
  local_4b0 = vsubps_avx512vl(local_560,auVar10);
  uVar107 = local_4b0._0_4_;
  auVar128._4_4_ = uVar107;
  auVar128._0_4_ = uVar107;
  auVar128._8_4_ = uVar107;
  auVar128._12_4_ = uVar107;
  auVar36 = vshufps_avx(local_4b0,local_4b0,0x55);
  auVar37 = vshufps_avx(local_4b0,local_4b0,0xaa);
  auVar117._0_4_ = fVar98 * auVar37._0_4_;
  auVar117._4_4_ = fVar106 * auVar37._4_4_;
  auVar117._8_4_ = fVar217 * auVar37._8_4_;
  auVar117._12_4_ = fVar202 * auVar37._12_4_;
  auVar36 = vfmadd231ps_fma(auVar117,(undefined1  [16])aVar2,auVar36);
  auVar39 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar1,auVar128);
  local_4c0 = vsubps_avx512vl(local_570,auVar10);
  uVar107 = local_4c0._0_4_;
  auVar164._4_4_ = uVar107;
  auVar164._0_4_ = uVar107;
  auVar164._8_4_ = uVar107;
  auVar164._12_4_ = uVar107;
  auVar36 = vshufps_avx(local_4c0,local_4c0,0x55);
  auVar37 = vshufps_avx(local_4c0,local_4c0,0xaa);
  auVar129._0_4_ = fVar98 * auVar37._0_4_;
  auVar129._4_4_ = fVar106 * auVar37._4_4_;
  auVar129._8_4_ = fVar217 * auVar37._8_4_;
  auVar129._12_4_ = fVar202 * auVar37._12_4_;
  auVar36 = vfmadd231ps_fma(auVar129,(undefined1  [16])aVar2,auVar36);
  auVar40 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar1,auVar164);
  local_4d0 = vsubps_avx(local_540,auVar10);
  uVar107 = local_4d0._0_4_;
  auVar165._4_4_ = uVar107;
  auVar165._0_4_ = uVar107;
  auVar165._8_4_ = uVar107;
  auVar165._12_4_ = uVar107;
  auVar36 = vshufps_avx(local_4d0,local_4d0,0x55);
  auVar37 = vshufps_avx(local_4d0,local_4d0,0xaa);
  auVar186._0_4_ = auVar37._0_4_ * fVar98;
  auVar186._4_4_ = auVar37._4_4_ * fVar106;
  auVar186._8_4_ = auVar37._8_4_ * fVar217;
  auVar186._12_4_ = auVar37._12_4_ * fVar202;
  auVar36 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar2,auVar36);
  auVar42 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar1,auVar165);
  local_4e0 = vsubps_avx(_local_530,auVar10);
  uVar107 = local_4e0._0_4_;
  auVar166._4_4_ = uVar107;
  auVar166._0_4_ = uVar107;
  auVar166._8_4_ = uVar107;
  auVar166._12_4_ = uVar107;
  auVar36 = vshufps_avx(local_4e0,local_4e0,0x55);
  auVar37 = vshufps_avx(local_4e0,local_4e0,0xaa);
  auVar197._0_4_ = auVar37._0_4_ * fVar98;
  auVar197._4_4_ = auVar37._4_4_ * fVar106;
  auVar197._8_4_ = auVar37._8_4_ * fVar217;
  auVar197._12_4_ = auVar37._12_4_ * fVar202;
  auVar36 = vfmadd231ps_fma(auVar197,(undefined1  [16])aVar2,auVar36);
  auVar43 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar1,auVar166);
  local_4f0 = vsubps_avx512vl(_local_580,auVar10);
  uVar107 = local_4f0._0_4_;
  auVar167._4_4_ = uVar107;
  auVar167._0_4_ = uVar107;
  auVar167._8_4_ = uVar107;
  auVar167._12_4_ = uVar107;
  auVar36 = vshufps_avx(local_4f0,local_4f0,0x55);
  auVar37 = vshufps_avx(local_4f0,local_4f0,0xaa);
  auVar203._0_4_ = auVar37._0_4_ * fVar98;
  auVar203._4_4_ = auVar37._4_4_ * fVar106;
  auVar203._8_4_ = auVar37._8_4_ * fVar217;
  auVar203._12_4_ = auVar37._12_4_ * fVar202;
  auVar36 = vfmadd231ps_fma(auVar203,(undefined1  [16])aVar2,auVar36);
  auVar44 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar1,auVar167);
  local_500 = vsubps_avx512vl(_local_590,auVar10);
  uVar107 = local_500._0_4_;
  auVar168._4_4_ = uVar107;
  auVar168._0_4_ = uVar107;
  auVar168._8_4_ = uVar107;
  auVar168._12_4_ = uVar107;
  auVar36 = vshufps_avx(local_500,local_500,0x55);
  auVar37 = vshufps_avx(local_500,local_500,0xaa);
  auVar219._0_4_ = auVar37._0_4_ * fVar98;
  auVar219._4_4_ = auVar37._4_4_ * fVar106;
  auVar219._8_4_ = auVar37._8_4_ * fVar217;
  auVar219._12_4_ = auVar37._12_4_ * fVar202;
  auVar36 = vfmadd231ps_fma(auVar219,(undefined1  [16])aVar2,auVar36);
  auVar45 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar1,auVar168);
  local_510 = vsubps_avx512vl(_local_550,auVar10);
  uVar107 = local_510._0_4_;
  auVar99._4_4_ = uVar107;
  auVar99._0_4_ = uVar107;
  auVar99._8_4_ = uVar107;
  auVar99._12_4_ = uVar107;
  auVar36 = vshufps_avx(local_510,local_510,0x55);
  auVar37 = vshufps_avx(local_510,local_510,0xaa);
  auVar157._0_4_ = auVar37._0_4_ * fVar98;
  auVar157._4_4_ = auVar37._4_4_ * fVar106;
  auVar157._8_4_ = auVar37._8_4_ * fVar217;
  auVar157._12_4_ = auVar37._12_4_ * fVar202;
  auVar36 = vfmadd231ps_fma(auVar157,(undefined1  [16])aVar2,auVar36);
  auVar10 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar1,auVar99);
  auVar38 = vmovlhps_avx(auVar41,auVar43);
  auVar47 = vmovlhps_avx512f(auVar39,auVar44);
  auVar9 = vmovlhps_avx512f(auVar40,auVar45);
  auVar46 = vmovlhps_avx512f(auVar42,auVar10);
  auVar36 = vminps_avx512vl(auVar38,auVar47);
  auVar49 = vmaxps_avx512vl(auVar38,auVar47);
  auVar37 = vminps_avx512vl(auVar9,auVar46);
  auVar37 = vminps_avx(auVar36,auVar37);
  auVar36 = vmaxps_avx512vl(auVar9,auVar46);
  auVar36 = vmaxps_avx(auVar49,auVar36);
  auVar49 = vshufpd_avx(auVar37,auVar37,3);
  auVar48 = vshufpd_avx(auVar36,auVar36,3);
  auVar37 = vminps_avx(auVar37,auVar49);
  auVar36 = vmaxps_avx(auVar36,auVar48);
  auVar37 = vandps_avx512vl(auVar37,auVar245._0_16_);
  auVar36 = vandps_avx512vl(auVar36,auVar245._0_16_);
  auVar36 = vmaxps_avx(auVar37,auVar36);
  auVar37 = vmovshdup_avx(auVar36);
  auVar36 = vmaxss_avx(auVar37,auVar36);
  fVar106 = auVar36._0_4_ * 9.536743e-07;
  auVar169._8_8_ = auVar41._0_8_;
  auVar169._0_8_ = auVar41._0_8_;
  auVar37 = vmovddup_avx512vl(auVar39);
  auVar49 = vmovddup_avx512vl(auVar40);
  auVar187._0_8_ = auVar42._0_8_;
  auVar187._8_8_ = auVar187._0_8_;
  auVar100._4_4_ = fVar106;
  auVar100._0_4_ = fVar106;
  auVar100._8_4_ = fVar106;
  auVar100._12_4_ = fVar106;
  local_3c0._16_4_ = fVar106;
  local_3c0._0_16_ = auVar100;
  local_3c0._20_4_ = fVar106;
  local_3c0._24_4_ = fVar106;
  local_3c0._28_4_ = fVar106;
  auVar36 = vxorps_avx512vl(auVar100,auVar61);
  local_3e0 = auVar36._0_4_;
  uStack_3dc = local_3e0;
  uStack_3d8 = local_3e0;
  uStack_3d4 = local_3e0;
  uStack_3d0 = local_3e0;
  uStack_3cc = local_3e0;
  uStack_3c8 = local_3e0;
  uStack_3c4 = local_3e0;
  auVar105 = vpbroadcastd_avx512f();
  local_300 = vmovdqa64_avx512f(auVar105);
  bVar29 = false;
  uVar20 = 0;
  fVar98 = *(float *)(ray + k * 4 + 0xc0);
  local_470 = vsubps_avx512vl(auVar47,auVar38);
  local_480 = vsubps_avx512vl(auVar9,auVar47);
  local_490 = vsubps_avx512vl(auVar46,auVar9);
  local_5b0 = vsubps_avx(_local_530,local_520);
  local_5c0 = vsubps_avx512vl(_local_580,local_560);
  local_5d0 = vsubps_avx512vl(_local_590,local_570);
  _local_5e0 = vsubps_avx512vl(_local_550,local_540);
  auVar105 = vpbroadcastd_avx512f();
  local_340 = vmovdqa64_avx512f(auVar105);
  auVar36 = ZEXT816(0x3f80000000000000);
  auVar96._16_48_ = auVar105._16_48_;
  auVar112 = auVar36;
LAB_01aea96c:
  do {
    auVar48 = vshufps_avx(auVar112,auVar112,0x50);
    auVar234._8_4_ = 0x3f800000;
    auVar234._0_8_ = 0x3f8000003f800000;
    auVar234._12_4_ = 0x3f800000;
    auVar82._16_4_ = 0x3f800000;
    auVar82._0_16_ = auVar234;
    auVar82._20_4_ = 0x3f800000;
    auVar82._24_4_ = 0x3f800000;
    auVar82._28_4_ = 0x3f800000;
    auVar41 = vsubps_avx(auVar234,auVar48);
    fVar217 = auVar48._0_4_;
    fVar123 = auVar43._0_4_;
    auVar135._0_4_ = fVar123 * fVar217;
    fVar202 = auVar48._4_4_;
    fVar124 = auVar43._4_4_;
    auVar135._4_4_ = fVar124 * fVar202;
    fVar213 = auVar48._8_4_;
    auVar135._8_4_ = fVar123 * fVar213;
    fVar215 = auVar48._12_4_;
    auVar135._12_4_ = fVar124 * fVar215;
    fVar134 = auVar44._0_4_;
    auVar145._0_4_ = fVar134 * fVar217;
    fVar139 = auVar44._4_4_;
    auVar145._4_4_ = fVar139 * fVar202;
    auVar145._8_4_ = fVar134 * fVar213;
    auVar145._12_4_ = fVar139 * fVar215;
    fVar140 = auVar45._0_4_;
    auVar158._0_4_ = fVar140 * fVar217;
    fVar141 = auVar45._4_4_;
    auVar158._4_4_ = fVar141 * fVar202;
    auVar158._8_4_ = fVar140 * fVar213;
    auVar158._12_4_ = fVar141 * fVar215;
    fVar201 = auVar10._0_4_;
    auVar118._0_4_ = fVar201 * fVar217;
    fVar212 = auVar10._4_4_;
    auVar118._4_4_ = fVar212 * fVar202;
    auVar118._8_4_ = fVar201 * fVar213;
    auVar118._12_4_ = fVar212 * fVar215;
    auVar39 = vfmadd231ps_fma(auVar135,auVar41,auVar169);
    auVar40 = vfmadd231ps_avx512vl(auVar145,auVar41,auVar37);
    auVar42 = vfmadd231ps_avx512vl(auVar158,auVar41,auVar49);
    auVar41 = vfmadd231ps_fma(auVar118,auVar187,auVar41);
    auVar48 = vmovshdup_avx(auVar36);
    fVar202 = auVar36._0_4_;
    fVar217 = (auVar48._0_4_ - fVar202) * 0.04761905;
    auVar76._4_4_ = fVar202;
    auVar76._0_4_ = fVar202;
    auVar76._8_4_ = fVar202;
    auVar76._12_4_ = fVar202;
    auVar76._16_4_ = fVar202;
    auVar76._20_4_ = fVar202;
    auVar76._24_4_ = fVar202;
    auVar76._28_4_ = fVar202;
    auVar66._0_8_ = auVar48._0_8_;
    auVar66._8_8_ = auVar66._0_8_;
    auVar66._16_8_ = auVar66._0_8_;
    auVar66._24_8_ = auVar66._0_8_;
    auVar79 = vsubps_avx(auVar66,auVar76);
    uVar107 = auVar39._0_4_;
    auVar80._4_4_ = uVar107;
    auVar80._0_4_ = uVar107;
    auVar80._8_4_ = uVar107;
    auVar80._12_4_ = uVar107;
    auVar80._16_4_ = uVar107;
    auVar80._20_4_ = uVar107;
    auVar80._24_4_ = uVar107;
    auVar80._28_4_ = uVar107;
    auVar68._8_4_ = 1;
    auVar68._0_8_ = 0x100000001;
    auVar68._12_4_ = 1;
    auVar68._16_4_ = 1;
    auVar68._20_4_ = 1;
    auVar68._24_4_ = 1;
    auVar68._28_4_ = 1;
    auVar78 = ZEXT1632(auVar39);
    auVar77 = vpermps_avx2(auVar68,auVar78);
    auVar62 = vbroadcastss_avx512vl(auVar40);
    auVar72 = ZEXT1632(auVar40);
    auVar63 = vpermps_avx512vl(auVar68,auVar72);
    auVar64 = vbroadcastss_avx512vl(auVar42);
    auVar73 = ZEXT1632(auVar42);
    auVar65 = vpermps_avx512vl(auVar68,auVar73);
    auVar66 = vbroadcastss_avx512vl(auVar41);
    auVar75 = ZEXT1632(auVar41);
    auVar67 = vpermps_avx512vl(auVar68,auVar75);
    auVar81._4_4_ = fVar217;
    auVar81._0_4_ = fVar217;
    auVar81._8_4_ = fVar217;
    auVar81._12_4_ = fVar217;
    auVar81._16_4_ = fVar217;
    auVar81._20_4_ = fVar217;
    auVar81._24_4_ = fVar217;
    auVar81._28_4_ = fVar217;
    auVar74._8_4_ = 2;
    auVar74._0_8_ = 0x200000002;
    auVar74._12_4_ = 2;
    auVar74._16_4_ = 2;
    auVar74._20_4_ = 2;
    auVar74._24_4_ = 2;
    auVar74._28_4_ = 2;
    auVar68 = vpermps_avx512vl(auVar74,auVar78);
    auVar69 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar70 = vpermps_avx512vl(auVar69,auVar78);
    auVar71 = vpermps_avx512vl(auVar74,auVar72);
    auVar72 = vpermps_avx512vl(auVar69,auVar72);
    auVar78 = vpermps_avx2(auVar74,auVar73);
    auVar73 = vpermps_avx512vl(auVar69,auVar73);
    auVar74 = vpermps_avx512vl(auVar74,auVar75);
    auVar69 = vpermps_avx512vl(auVar69,auVar75);
    auVar48 = vfmadd132ps_fma(auVar79,auVar76,_DAT_01faff20);
    auVar79 = vsubps_avx(auVar82,ZEXT1632(auVar48));
    auVar75 = vmulps_avx512vl(auVar62,ZEXT1632(auVar48));
    auVar82 = ZEXT1632(auVar48);
    auVar76 = vmulps_avx512vl(auVar63,auVar82);
    auVar41 = vfmadd231ps_fma(auVar75,auVar79,auVar80);
    auVar39 = vfmadd231ps_fma(auVar76,auVar79,auVar77);
    auVar75 = vmulps_avx512vl(auVar64,auVar82);
    auVar76 = vmulps_avx512vl(auVar65,auVar82);
    auVar75 = vfmadd231ps_avx512vl(auVar75,auVar79,auVar62);
    auVar76 = vfmadd231ps_avx512vl(auVar76,auVar79,auVar63);
    auVar62 = vmulps_avx512vl(auVar66,auVar82);
    auVar80 = ZEXT1632(auVar48);
    auVar63 = vmulps_avx512vl(auVar67,auVar80);
    auVar64 = vfmadd231ps_avx512vl(auVar62,auVar79,auVar64);
    auVar65 = vfmadd231ps_avx512vl(auVar63,auVar79,auVar65);
    fVar213 = auVar48._0_4_;
    fVar215 = auVar48._4_4_;
    auVar62._4_4_ = fVar215 * auVar75._4_4_;
    auVar62._0_4_ = fVar213 * auVar75._0_4_;
    fVar214 = auVar48._8_4_;
    auVar62._8_4_ = fVar214 * auVar75._8_4_;
    fVar216 = auVar48._12_4_;
    auVar62._12_4_ = fVar216 * auVar75._12_4_;
    auVar62._16_4_ = auVar75._16_4_ * 0.0;
    auVar62._20_4_ = auVar75._20_4_ * 0.0;
    auVar62._24_4_ = auVar75._24_4_ * 0.0;
    auVar62._28_4_ = fVar202;
    auVar63._4_4_ = fVar215 * auVar76._4_4_;
    auVar63._0_4_ = fVar213 * auVar76._0_4_;
    auVar63._8_4_ = fVar214 * auVar76._8_4_;
    auVar63._12_4_ = fVar216 * auVar76._12_4_;
    auVar63._16_4_ = auVar76._16_4_ * 0.0;
    auVar63._20_4_ = auVar76._20_4_ * 0.0;
    auVar63._24_4_ = auVar76._24_4_ * 0.0;
    auVar63._28_4_ = auVar77._28_4_;
    auVar41 = vfmadd231ps_fma(auVar62,auVar79,ZEXT1632(auVar41));
    auVar39 = vfmadd231ps_fma(auVar63,auVar79,ZEXT1632(auVar39));
    auVar67._0_4_ = fVar213 * auVar64._0_4_;
    auVar67._4_4_ = fVar215 * auVar64._4_4_;
    auVar67._8_4_ = fVar214 * auVar64._8_4_;
    auVar67._12_4_ = fVar216 * auVar64._12_4_;
    auVar67._16_4_ = auVar64._16_4_ * 0.0;
    auVar67._20_4_ = auVar64._20_4_ * 0.0;
    auVar67._24_4_ = auVar64._24_4_ * 0.0;
    auVar67._28_4_ = 0;
    auVar77._4_4_ = fVar215 * auVar65._4_4_;
    auVar77._0_4_ = fVar213 * auVar65._0_4_;
    auVar77._8_4_ = fVar214 * auVar65._8_4_;
    auVar77._12_4_ = fVar216 * auVar65._12_4_;
    auVar77._16_4_ = auVar65._16_4_ * 0.0;
    auVar77._20_4_ = auVar65._20_4_ * 0.0;
    auVar77._24_4_ = auVar65._24_4_ * 0.0;
    auVar77._28_4_ = auVar64._28_4_;
    auVar40 = vfmadd231ps_fma(auVar67,auVar79,auVar75);
    auVar42 = vfmadd231ps_fma(auVar77,auVar79,auVar76);
    auVar64._28_4_ = auVar76._28_4_;
    auVar64._0_28_ =
         ZEXT1628(CONCAT412(fVar216 * auVar42._12_4_,
                            CONCAT48(fVar214 * auVar42._8_4_,
                                     CONCAT44(fVar215 * auVar42._4_4_,fVar213 * auVar42._0_4_))));
    auVar50 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar216 * auVar40._12_4_,
                                                 CONCAT48(fVar214 * auVar40._8_4_,
                                                          CONCAT44(fVar215 * auVar40._4_4_,
                                                                   fVar213 * auVar40._0_4_)))),
                              auVar79,ZEXT1632(auVar41));
    auVar57 = vfmadd231ps_fma(auVar64,auVar79,ZEXT1632(auVar39));
    auVar77 = vsubps_avx(ZEXT1632(auVar40),ZEXT1632(auVar41));
    auVar62 = vsubps_avx(ZEXT1632(auVar42),ZEXT1632(auVar39));
    auVar63 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar77 = vmulps_avx512vl(auVar77,auVar63);
    auVar62 = vmulps_avx512vl(auVar62,auVar63);
    auVar75._0_4_ = fVar217 * auVar77._0_4_;
    auVar75._4_4_ = fVar217 * auVar77._4_4_;
    auVar75._8_4_ = fVar217 * auVar77._8_4_;
    auVar75._12_4_ = fVar217 * auVar77._12_4_;
    auVar75._16_4_ = fVar217 * auVar77._16_4_;
    auVar75._20_4_ = fVar217 * auVar77._20_4_;
    auVar75._24_4_ = fVar217 * auVar77._24_4_;
    auVar75._28_4_ = 0;
    auVar77 = vmulps_avx512vl(auVar81,auVar62);
    auVar39 = vxorps_avx512vl(auVar66._0_16_,auVar66._0_16_);
    auVar62 = vpermt2ps_avx512vl(ZEXT1632(auVar50),_DAT_01feed00,ZEXT1632(auVar39));
    auVar64 = vpermt2ps_avx512vl(ZEXT1632(auVar57),_DAT_01feed00,ZEXT1632(auVar39));
    auVar122._0_4_ = auVar75._0_4_ + auVar50._0_4_;
    auVar122._4_4_ = auVar75._4_4_ + auVar50._4_4_;
    auVar122._8_4_ = auVar75._8_4_ + auVar50._8_4_;
    auVar122._12_4_ = auVar75._12_4_ + auVar50._12_4_;
    auVar122._16_4_ = auVar75._16_4_ + 0.0;
    auVar122._20_4_ = auVar75._20_4_ + 0.0;
    auVar122._24_4_ = auVar75._24_4_ + 0.0;
    auVar122._28_4_ = 0;
    auVar76 = ZEXT1632(auVar39);
    auVar65 = vpermt2ps_avx512vl(auVar75,_DAT_01feed00,auVar76);
    auVar66 = vaddps_avx512vl(ZEXT1632(auVar57),auVar77);
    auVar67 = vpermt2ps_avx512vl(auVar77,_DAT_01feed00,auVar76);
    auVar77 = vsubps_avx(auVar62,auVar65);
    auVar67 = vsubps_avx512vl(auVar64,auVar67);
    auVar65 = vmulps_avx512vl(auVar71,auVar80);
    auVar75 = vmulps_avx512vl(auVar72,auVar80);
    auVar65 = vfmadd231ps_avx512vl(auVar65,auVar79,auVar68);
    auVar68 = vfmadd231ps_avx512vl(auVar75,auVar79,auVar70);
    auVar70 = vmulps_avx512vl(auVar78,auVar80);
    auVar75 = vmulps_avx512vl(auVar73,auVar80);
    auVar70 = vfmadd231ps_avx512vl(auVar70,auVar79,auVar71);
    auVar71 = vfmadd231ps_avx512vl(auVar75,auVar79,auVar72);
    auVar72 = vmulps_avx512vl(auVar74,auVar80);
    auVar69 = vmulps_avx512vl(auVar69,auVar80);
    auVar41 = vfmadd231ps_fma(auVar72,auVar79,auVar78);
    auVar78 = vfmadd231ps_avx512vl(auVar69,auVar79,auVar73);
    auVar69 = vmulps_avx512vl(auVar80,auVar70);
    auVar74 = ZEXT1632(auVar48);
    auVar72 = vmulps_avx512vl(auVar74,auVar71);
    auVar65 = vfmadd231ps_avx512vl(auVar69,auVar79,auVar65);
    auVar68 = vfmadd231ps_avx512vl(auVar72,auVar79,auVar68);
    auVar78 = vmulps_avx512vl(auVar74,auVar78);
    auVar69 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar216 * auVar41._12_4_,
                                            CONCAT48(fVar214 * auVar41._8_4_,
                                                     CONCAT44(fVar215 * auVar41._4_4_,
                                                              fVar213 * auVar41._0_4_)))),auVar79,
                         auVar70);
    auVar70 = vfmadd231ps_avx512vl(auVar78,auVar79,auVar71);
    auVar78._4_4_ = fVar215 * auVar69._4_4_;
    auVar78._0_4_ = fVar213 * auVar69._0_4_;
    auVar78._8_4_ = fVar214 * auVar69._8_4_;
    auVar78._12_4_ = fVar216 * auVar69._12_4_;
    auVar78._16_4_ = auVar69._16_4_ * 0.0;
    auVar78._20_4_ = auVar69._20_4_ * 0.0;
    auVar78._24_4_ = auVar69._24_4_ * 0.0;
    auVar78._28_4_ = auVar73._28_4_;
    auVar71 = vmulps_avx512vl(auVar74,auVar70);
    auVar78 = vfmadd231ps_avx512vl(auVar78,auVar79,auVar65);
    auVar71 = vfmadd231ps_avx512vl(auVar71,auVar68,auVar79);
    auVar79 = vsubps_avx512vl(auVar69,auVar65);
    auVar65 = vsubps_avx512vl(auVar70,auVar68);
    auVar68 = vmulps_avx512vl(auVar79,auVar63);
    auVar63 = vmulps_avx512vl(auVar65,auVar63);
    fVar202 = fVar217 * auVar68._0_4_;
    fVar213 = fVar217 * auVar68._4_4_;
    auVar79._4_4_ = fVar213;
    auVar79._0_4_ = fVar202;
    fVar215 = fVar217 * auVar68._8_4_;
    auVar79._8_4_ = fVar215;
    fVar214 = fVar217 * auVar68._12_4_;
    auVar79._12_4_ = fVar214;
    fVar216 = fVar217 * auVar68._16_4_;
    auVar79._16_4_ = fVar216;
    fVar218 = fVar217 * auVar68._20_4_;
    auVar79._20_4_ = fVar218;
    fVar217 = fVar217 * auVar68._24_4_;
    auVar79._24_4_ = fVar217;
    auVar79._28_4_ = auVar68._28_4_;
    auVar63 = vmulps_avx512vl(auVar81,auVar63);
    auVar69 = vpermt2ps_avx512vl(auVar78,_DAT_01feed00,auVar76);
    auVar70 = vpermt2ps_avx512vl(auVar71,_DAT_01feed00,auVar76);
    auVar200._0_4_ = auVar78._0_4_ + fVar202;
    auVar200._4_4_ = auVar78._4_4_ + fVar213;
    auVar200._8_4_ = auVar78._8_4_ + fVar215;
    auVar200._12_4_ = auVar78._12_4_ + fVar214;
    auVar200._16_4_ = auVar78._16_4_ + fVar216;
    auVar200._20_4_ = auVar78._20_4_ + fVar218;
    auVar200._24_4_ = auVar78._24_4_ + fVar217;
    auVar200._28_4_ = auVar78._28_4_ + auVar68._28_4_;
    auVar79 = vpermt2ps_avx512vl(auVar79,_DAT_01feed00,ZEXT1632(auVar39));
    auVar68 = vaddps_avx512vl(auVar71,auVar63);
    auVar63 = vpermt2ps_avx512vl(auVar63,_DAT_01feed00,ZEXT1632(auVar39));
    auVar79 = vsubps_avx(auVar69,auVar79);
    auVar63 = vsubps_avx512vl(auVar70,auVar63);
    auVar138 = ZEXT1632(auVar50);
    auVar65 = vsubps_avx512vl(auVar78,auVar138);
    auVar151 = ZEXT1632(auVar57);
    auVar72 = vsubps_avx512vl(auVar71,auVar151);
    auVar73 = vsubps_avx512vl(auVar69,auVar62);
    auVar65 = vaddps_avx512vl(auVar65,auVar73);
    auVar73 = vsubps_avx512vl(auVar70,auVar64);
    auVar72 = vaddps_avx512vl(auVar72,auVar73);
    auVar73 = vmulps_avx512vl(auVar151,auVar65);
    auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar138,auVar72);
    auVar74 = vmulps_avx512vl(auVar66,auVar65);
    auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar122,auVar72);
    auVar75 = vmulps_avx512vl(auVar67,auVar65);
    auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar77,auVar72);
    auVar76 = vmulps_avx512vl(auVar64,auVar65);
    auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar62,auVar72);
    auVar80 = vmulps_avx512vl(auVar71,auVar65);
    auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar78,auVar72);
    auVar81 = vmulps_avx512vl(auVar68,auVar65);
    auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar200,auVar72);
    auVar82 = vmulps_avx512vl(auVar63,auVar65);
    auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar79,auVar72);
    auVar65 = vmulps_avx512vl(auVar70,auVar65);
    auVar65 = vfnmadd231ps_avx512vl(auVar65,auVar69,auVar72);
    auVar72 = vminps_avx512vl(auVar73,auVar74);
    auVar73 = vmaxps_avx512vl(auVar73,auVar74);
    auVar74 = vminps_avx512vl(auVar75,auVar76);
    auVar72 = vminps_avx512vl(auVar72,auVar74);
    auVar74 = vmaxps_avx512vl(auVar75,auVar76);
    auVar73 = vmaxps_avx512vl(auVar73,auVar74);
    auVar74 = vminps_avx512vl(auVar80,auVar81);
    auVar75 = vmaxps_avx512vl(auVar80,auVar81);
    auVar76 = vminps_avx512vl(auVar82,auVar65);
    auVar74 = vminps_avx512vl(auVar74,auVar76);
    auVar72 = vminps_avx512vl(auVar72,auVar74);
    auVar65 = vmaxps_avx512vl(auVar82,auVar65);
    auVar65 = vmaxps_avx512vl(auVar75,auVar65);
    auVar73 = vmaxps_avx512vl(auVar73,auVar65);
    uVar11 = vcmpps_avx512vl(auVar72,local_3c0,2);
    auVar65._4_4_ = uStack_3dc;
    auVar65._0_4_ = local_3e0;
    auVar65._8_4_ = uStack_3d8;
    auVar65._12_4_ = uStack_3d4;
    auVar65._16_4_ = uStack_3d0;
    auVar65._20_4_ = uStack_3cc;
    auVar65._24_4_ = uStack_3c8;
    auVar65._28_4_ = uStack_3c4;
    uVar12 = vcmpps_avx512vl(auVar73,auVar65,5);
    bVar24 = (byte)uVar11 & (byte)uVar12 & 0x7f;
    if (bVar24 != 0) {
      auVar72 = vsubps_avx512vl(auVar62,auVar138);
      auVar73 = vsubps_avx512vl(auVar64,auVar151);
      auVar74 = vsubps_avx512vl(auVar69,auVar78);
      auVar72 = vaddps_avx512vl(auVar72,auVar74);
      auVar74 = vsubps_avx512vl(auVar70,auVar71);
      auVar73 = vaddps_avx512vl(auVar73,auVar74);
      auVar74 = vmulps_avx512vl(auVar151,auVar72);
      auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar73,auVar138);
      auVar66 = vmulps_avx512vl(auVar66,auVar72);
      auVar66 = vfnmadd213ps_avx512vl(auVar122,auVar73,auVar66);
      auVar67 = vmulps_avx512vl(auVar67,auVar72);
      auVar67 = vfnmadd213ps_avx512vl(auVar77,auVar73,auVar67);
      auVar77 = vmulps_avx512vl(auVar64,auVar72);
      auVar64 = vfnmadd231ps_avx512vl(auVar77,auVar73,auVar62);
      auVar77 = vmulps_avx512vl(auVar71,auVar72);
      auVar71 = vfnmadd231ps_avx512vl(auVar77,auVar73,auVar78);
      auVar77 = vmulps_avx512vl(auVar68,auVar72);
      auVar68 = vfnmadd213ps_avx512vl(auVar200,auVar73,auVar77);
      auVar77 = vmulps_avx512vl(auVar63,auVar72);
      auVar75 = vfnmadd213ps_avx512vl(auVar79,auVar73,auVar77);
      auVar79 = vmulps_avx512vl(auVar70,auVar72);
      auVar69 = vfnmadd231ps_avx512vl(auVar79,auVar69,auVar73);
      auVar77 = vminps_avx(auVar74,auVar66);
      auVar79 = vmaxps_avx(auVar74,auVar66);
      auVar62 = vminps_avx(auVar67,auVar64);
      auVar62 = vminps_avx(auVar77,auVar62);
      auVar77 = vmaxps_avx(auVar67,auVar64);
      auVar79 = vmaxps_avx(auVar79,auVar77);
      auVar78 = vminps_avx(auVar71,auVar68);
      auVar77 = vmaxps_avx(auVar71,auVar68);
      auVar63 = vminps_avx(auVar75,auVar69);
      auVar78 = vminps_avx(auVar78,auVar63);
      auVar78 = vminps_avx(auVar62,auVar78);
      auVar62 = vmaxps_avx(auVar75,auVar69);
      auVar77 = vmaxps_avx(auVar77,auVar62);
      auVar79 = vmaxps_avx(auVar79,auVar77);
      uVar11 = vcmpps_avx512vl(auVar79,auVar65,5);
      uVar12 = vcmpps_avx512vl(auVar78,local_3c0,2);
      bVar24 = bVar24 & (byte)uVar11 & (byte)uVar12;
      if (bVar24 != 0) {
        auStack_620[uVar20] = (uint)bVar24;
        uVar11 = vmovlps_avx(auVar36);
        (&uStack_460)[uVar20] = uVar11;
        uVar27 = vmovlps_avx(auVar112);
        auStack_3a0[uVar20] = uVar27;
        uVar20 = (ulong)((int)uVar20 + 1);
      }
    }
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar105 = ZEXT1664(auVar36);
    auVar79 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar242 = ZEXT3264(auVar79);
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar243 = ZEXT1664(auVar36);
    auVar96._0_32_ = _DAT_01feed20;
    auVar244 = ZEXT3264(_DAT_01feed20);
LAB_01aeae78:
    do {
      do {
        auVar48 = SUB6416(ZEXT464(0xb8d1b717),0);
        if ((int)uVar20 == 0) {
          if (bVar29) {
            return bVar29;
          }
          uVar107 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar18._4_4_ = uVar107;
          auVar18._0_4_ = uVar107;
          auVar18._8_4_ = uVar107;
          auVar18._12_4_ = uVar107;
          uVar11 = vcmpps_avx512vl(local_5a0,auVar18,2);
          uVar28 = (uint)uVar35 & (uint)uVar11;
          uVar35 = (ulong)uVar28;
          if (uVar28 == 0) {
            return bVar29;
          }
          goto LAB_01aea204;
        }
        uVar25 = (int)uVar20 - 1;
        uVar26 = (ulong)uVar25;
        uVar4 = auStack_620[uVar26];
        auVar112._8_8_ = 0;
        auVar112._0_8_ = auStack_3a0[uVar26];
        uVar27 = 0;
        for (uVar22 = (ulong)uVar4; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
          uVar27 = uVar27 + 1;
        }
        uVar21 = uVar4 - 1 & uVar4;
        bVar32 = uVar21 == 0;
        auStack_620[uVar26] = uVar21;
        if (bVar32) {
          uVar20 = (ulong)uVar25;
        }
        auVar101._8_8_ = 0;
        auVar101._0_8_ = uVar27;
        auVar36 = vpunpcklqdq_avx(auVar101,ZEXT416((int)uVar27 + 1));
        auVar36 = vcvtqq2ps_avx512vl(auVar36);
        auVar36 = vmulps_avx512vl(auVar36,auVar243._0_16_);
        uVar107 = *(undefined4 *)((long)&uStack_460 + uVar26 * 8 + 4);
        auVar13._4_4_ = uVar107;
        auVar13._0_4_ = uVar107;
        auVar13._8_4_ = uVar107;
        auVar13._12_4_ = uVar107;
        auVar41 = vmulps_avx512vl(auVar36,auVar13);
        auVar39 = auVar246._0_16_;
        auVar36 = vsubps_avx512vl(auVar39,auVar36);
        uVar107 = *(undefined4 *)(&uStack_460 + uVar26);
        auVar14._4_4_ = uVar107;
        auVar14._0_4_ = uVar107;
        auVar14._8_4_ = uVar107;
        auVar14._12_4_ = uVar107;
        auVar36 = vfmadd231ps_avx512vl(auVar41,auVar36,auVar14);
        auVar41 = vmovshdup_avx(auVar36);
        fVar217 = auVar41._0_4_ - auVar36._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar217));
        if (uVar4 == 0 || bVar32) goto LAB_01aea96c;
        auVar41 = vshufps_avx(auVar112,auVar112,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar217));
        bVar30 = (uint)uVar20 < 4;
        uVar25 = (uint)uVar20 - 4;
        bVar33 = uVar25 == 0;
        bVar31 = (POPCOUNT(uVar25 & 0xff) & 1U) == 0;
        auVar50 = vsubps_avx512vl(auVar39,auVar41);
        fVar202 = auVar41._0_4_;
        auVar146._0_4_ = fVar202 * fVar123;
        fVar213 = auVar41._4_4_;
        auVar146._4_4_ = fVar213 * fVar124;
        fVar215 = auVar41._8_4_;
        auVar146._8_4_ = fVar215 * fVar123;
        fVar214 = auVar41._12_4_;
        auVar146._12_4_ = fVar214 * fVar124;
        auVar159._0_4_ = fVar202 * fVar134;
        auVar159._4_4_ = fVar213 * fVar139;
        auVar159._8_4_ = fVar215 * fVar134;
        auVar159._12_4_ = fVar214 * fVar139;
        auVar170._0_4_ = fVar202 * fVar140;
        auVar170._4_4_ = fVar213 * fVar141;
        auVar170._8_4_ = fVar215 * fVar140;
        auVar170._12_4_ = fVar214 * fVar141;
        auVar130._0_4_ = fVar202 * fVar201;
        auVar130._4_4_ = fVar213 * fVar212;
        auVar130._8_4_ = fVar215 * fVar201;
        auVar130._12_4_ = fVar214 * fVar212;
        auVar41 = vfmadd231ps_fma(auVar146,auVar50,auVar169);
        auVar40 = vfmadd231ps_fma(auVar159,auVar50,auVar37);
        auVar42 = vfmadd231ps_fma(auVar170,auVar50,auVar49);
        auVar50 = vfmadd231ps_fma(auVar130,auVar50,auVar187);
        auVar69._16_16_ = auVar41;
        auVar69._0_16_ = auVar41;
        auVar70._16_16_ = auVar40;
        auVar70._0_16_ = auVar40;
        auVar72._16_16_ = auVar42;
        auVar72._0_16_ = auVar42;
        auVar97._32_32_ = auVar96._32_32_;
        auVar77 = vpermps_avx512vl(auVar244._0_32_,ZEXT1632(auVar36));
        auVar79 = vsubps_avx(auVar70,auVar69);
        auVar40 = vfmadd213ps_fma(auVar79,auVar77,auVar69);
        auVar79 = vsubps_avx(auVar72,auVar70);
        auVar57 = vfmadd213ps_fma(auVar79,auVar77,auVar70);
        auVar41 = vsubps_avx(auVar50,auVar42);
        auVar71._16_16_ = auVar41;
        auVar71._0_16_ = auVar41;
        auVar41 = vfmadd213ps_fma(auVar71,auVar77,auVar72);
        auVar79 = vsubps_avx(ZEXT1632(auVar57),ZEXT1632(auVar40));
        auVar40 = vfmadd213ps_fma(auVar79,auVar77,ZEXT1632(auVar40));
        auVar79 = vsubps_avx(ZEXT1632(auVar41),ZEXT1632(auVar57));
        auVar41 = vfmadd213ps_fma(auVar79,auVar77,ZEXT1632(auVar57));
        auVar79 = vsubps_avx(ZEXT1632(auVar41),ZEXT1632(auVar40));
        auVar142 = vfmadd231ps_fma(ZEXT1632(auVar40),auVar79,auVar77);
        auVar97._0_32_ = vmulps_avx512vl(auVar79,auVar242._0_32_);
        auVar96._16_48_ = auVar97._16_48_;
        auVar41 = vmulss_avx512f(ZEXT416((uint)fVar217),SUB6416(ZEXT464(0x3eaaaaab),0));
        fVar202 = auVar41._0_4_;
        auVar171._0_8_ =
             CONCAT44(auVar142._4_4_ + fVar202 * auVar97._4_4_,
                      auVar142._0_4_ + fVar202 * auVar97._0_4_);
        auVar171._8_4_ = auVar142._8_4_ + fVar202 * auVar97._8_4_;
        auVar171._12_4_ = auVar142._12_4_ + fVar202 * auVar97._12_4_;
        auVar147._0_4_ = fVar202 * auVar97._16_4_;
        auVar147._4_4_ = fVar202 * auVar97._20_4_;
        auVar147._8_4_ = fVar202 * auVar97._24_4_;
        auVar147._12_4_ = fVar202 * auVar97._28_4_;
        auVar56 = vsubps_avx((undefined1  [16])0x0,auVar147);
        auVar57 = vshufpd_avx(auVar142,auVar142,3);
        auVar61 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar41 = vsubps_avx(auVar57,auVar142);
        auVar40 = vsubps_avx(auVar61,(undefined1  [16])0x0);
        auVar188._0_4_ = auVar41._0_4_ + auVar40._0_4_;
        auVar188._4_4_ = auVar41._4_4_ + auVar40._4_4_;
        auVar188._8_4_ = auVar41._8_4_ + auVar40._8_4_;
        auVar188._12_4_ = auVar41._12_4_ + auVar40._12_4_;
        auVar41 = vshufps_avx(auVar142,auVar142,0xb1);
        auVar40 = vshufps_avx(auVar171,auVar171,0xb1);
        auVar42 = vshufps_avx(auVar56,auVar56,0xb1);
        auVar50 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar235._4_4_ = auVar188._0_4_;
        auVar235._0_4_ = auVar188._0_4_;
        auVar235._8_4_ = auVar188._0_4_;
        auVar235._12_4_ = auVar188._0_4_;
        auVar53 = vshufps_avx(auVar188,auVar188,0x55);
        fVar202 = auVar53._0_4_;
        auVar198._0_4_ = auVar41._0_4_ * fVar202;
        fVar213 = auVar53._4_4_;
        auVar198._4_4_ = auVar41._4_4_ * fVar213;
        fVar215 = auVar53._8_4_;
        auVar198._8_4_ = auVar41._8_4_ * fVar215;
        fVar214 = auVar53._12_4_;
        auVar198._12_4_ = auVar41._12_4_ * fVar214;
        auVar204._0_4_ = auVar40._0_4_ * fVar202;
        auVar204._4_4_ = auVar40._4_4_ * fVar213;
        auVar204._8_4_ = auVar40._8_4_ * fVar215;
        auVar204._12_4_ = auVar40._12_4_ * fVar214;
        auVar220._0_4_ = auVar42._0_4_ * fVar202;
        auVar220._4_4_ = auVar42._4_4_ * fVar213;
        auVar220._8_4_ = auVar42._8_4_ * fVar215;
        auVar220._12_4_ = auVar42._12_4_ * fVar214;
        auVar189._0_4_ = auVar50._0_4_ * fVar202;
        auVar189._4_4_ = auVar50._4_4_ * fVar213;
        auVar189._8_4_ = auVar50._8_4_ * fVar215;
        auVar189._12_4_ = auVar50._12_4_ * fVar214;
        auVar41 = vfmadd231ps_fma(auVar198,auVar235,auVar142);
        auVar40 = vfmadd231ps_fma(auVar204,auVar235,auVar171);
        auVar55 = vfmadd231ps_fma(auVar220,auVar235,auVar56);
        auVar60 = vfmadd231ps_fma(auVar189,(undefined1  [16])0x0,auVar235);
        auVar53 = vshufpd_avx(auVar41,auVar41,1);
        auVar54 = vshufpd_avx(auVar40,auVar40,1);
        auVar51 = vshufpd_avx512vl(auVar55,auVar55,1);
        auVar52 = vshufpd_avx512vl(auVar60,auVar60,1);
        auVar42 = vminss_avx(auVar41,auVar40);
        auVar41 = vmaxss_avx(auVar40,auVar41);
        auVar50 = vminss_avx(auVar55,auVar60);
        auVar40 = vmaxss_avx(auVar60,auVar55);
        auVar42 = vminss_avx(auVar42,auVar50);
        auVar41 = vmaxss_avx(auVar40,auVar41);
        auVar50 = vminss_avx(auVar53,auVar54);
        auVar40 = vmaxss_avx(auVar54,auVar53);
        auVar53 = vminss_avx512f(auVar51,auVar52);
        auVar54 = vmaxss_avx512f(auVar52,auVar51);
        vmaxss_avx(auVar54,auVar40);
        auVar96._0_16_ = vminss_avx512f(auVar50,auVar53);
        vucomiss_avx512f(auVar42);
        if ((!bVar30 && !bVar33) &&
           (auVar40 = vucomiss_avx512f(auVar48), bVar34 = bVar33, !bVar30 && !bVar33)) break;
        auVar40 = vucomiss_avx512f(auVar48);
        auVar50 = vucomiss_avx512f(auVar96._0_16_);
        auVar41 = vucomiss_avx512f(auVar48);
        bVar34 = bVar30 || bVar33;
        bVar31 = bVar30 || bVar33;
        if (!bVar30 && !bVar33) break;
        uVar11 = vcmpps_avx512vl(auVar42,auVar50,5);
        uVar12 = vcmpps_avx512vl(auVar96._0_16_,auVar50,5);
        uVar25 = (uint)uVar11 & (uint)uVar12;
        bVar19 = (uVar25 & 1) == 0;
        bVar34 = (!bVar30 && !bVar33) && bVar19;
        bVar31 = (!bVar30 && !bVar33) && (uVar25 & 1) == 0;
      } while ((bVar30 || bVar33) || !bVar19);
      auVar53 = auVar247._0_16_;
      vcmpss_avx512f(auVar42,auVar53,1);
      uVar11 = vcmpss_avx512f(auVar41,auVar53,1);
      bVar33 = (bool)((byte)uVar11 & 1);
      auVar84._16_48_ = auVar96._16_48_;
      auVar84._0_16_ = auVar248._0_16_;
      auVar83._4_60_ = auVar84._4_60_;
      auVar83._0_4_ = (float)((uint)bVar33 * -0x40800000 + (uint)!bVar33 * auVar248._0_4_);
      vucomiss_avx512f(auVar83._0_16_);
      bVar31 = (bool)(!bVar34 | bVar31);
      bVar34 = bVar31 == false;
      auVar86._16_48_ = auVar96._16_48_;
      auVar86._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar85._4_60_ = auVar86._4_60_;
      auVar85._0_4_ = (uint)bVar31 * auVar247._0_4_ + (uint)!bVar31 * 0x7f800000;
      auVar50 = auVar85._0_16_;
      auVar88._16_48_ = auVar96._16_48_;
      auVar88._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar87._4_60_ = auVar88._4_60_;
      auVar87._0_4_ = (uint)bVar31 * auVar247._0_4_ + (uint)!bVar31 * -0x800000;
      auVar48 = auVar87._0_16_;
      uVar11 = vcmpss_avx512f(auVar96._0_16_,auVar53,1);
      bVar33 = (bool)((byte)uVar11 & 1);
      auVar90._16_48_ = auVar96._16_48_;
      auVar90._0_16_ = auVar248._0_16_;
      auVar89._4_60_ = auVar90._4_60_;
      auVar89._0_4_ = (float)((uint)bVar33 * -0x40800000 + (uint)!bVar33 * auVar248._0_4_);
      vucomiss_avx512f(auVar89._0_16_);
      if ((bVar31) || (bVar34)) {
        auVar54 = vucomiss_avx512f(auVar42);
        if ((bVar31) || (bVar34)) {
          auVar17._8_4_ = 0x80000000;
          auVar17._0_8_ = 0x8000000080000000;
          auVar17._12_4_ = 0x80000000;
          auVar55 = vxorps_avx512vl(auVar42,auVar17);
          auVar42 = vsubss_avx512f(auVar54,auVar42);
          auVar42 = vdivss_avx512f(auVar55,auVar42);
          auVar54 = vsubss_avx512f(ZEXT416(0x3f800000),auVar42);
          auVar54 = vfmadd213ss_avx512f(auVar54,auVar53,auVar42);
          auVar42 = auVar54;
        }
        else {
          auVar42 = vxorps_avx512vl(auVar54,auVar54);
          vucomiss_avx512f(auVar42);
          auVar54 = ZEXT416(0x3f800000);
          if ((bVar31) || (bVar34)) {
            auVar54 = SUB6416(ZEXT464(0xff800000),0);
            auVar42 = SUB6416(ZEXT464(0x7f800000),0);
          }
        }
        auVar50 = vminss_avx512f(auVar50,auVar42);
        auVar48 = vmaxss_avx(auVar54,auVar48);
      }
      auVar248 = ZEXT464(0x3f800000);
      uVar11 = vcmpss_avx512f(auVar40,auVar53,1);
      bVar31 = (bool)((byte)uVar11 & 1);
      auVar42 = auVar248._0_16_;
      fVar202 = (float)((uint)bVar31 * -0x40800000 + (uint)!bVar31 * 0x3f800000);
      if ((auVar83._0_4_ != fVar202) || (NAN(auVar83._0_4_) || NAN(fVar202))) {
        fVar215 = auVar40._0_4_;
        fVar213 = auVar41._0_4_;
        if ((fVar215 != fVar213) || (NAN(fVar215) || NAN(fVar213))) {
          auVar16._8_4_ = 0x80000000;
          auVar16._0_8_ = 0x8000000080000000;
          auVar16._12_4_ = 0x80000000;
          auVar41 = vxorps_avx512vl(auVar41,auVar16);
          auVar190._0_4_ = auVar41._0_4_ / (fVar215 - fVar213);
          auVar190._4_12_ = auVar41._4_12_;
          auVar41 = vsubss_avx512f(auVar42,auVar190);
          auVar41 = vfmadd213ss_avx512f(auVar41,auVar53,auVar190);
          auVar40 = auVar41;
        }
        else if ((fVar213 != 0.0) || (auVar41 = auVar42, auVar40 = ZEXT816(0) << 0x40, NAN(fVar213))
                ) {
          auVar41 = SUB6416(ZEXT464(0xff800000),0);
          auVar40 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar50 = vminss_avx(auVar50,auVar40);
        auVar48 = vmaxss_avx(auVar41,auVar48);
      }
      bVar31 = auVar89._0_4_ != fVar202;
      auVar41 = vminss_avx512f(auVar50,auVar42);
      auVar92._16_48_ = auVar96._16_48_;
      auVar92._0_16_ = auVar50;
      auVar91._4_60_ = auVar92._4_60_;
      auVar91._0_4_ = (uint)bVar31 * auVar41._0_4_ + (uint)!bVar31 * auVar50._0_4_;
      auVar41 = vmaxss_avx512f(auVar42,auVar48);
      auVar94._16_48_ = auVar96._16_48_;
      auVar94._0_16_ = auVar48;
      auVar93._4_60_ = auVar94._4_60_;
      auVar93._0_4_ = (uint)bVar31 * auVar41._0_4_ + (uint)!bVar31 * auVar48._0_4_;
      auVar48 = vmaxss_avx512f(auVar53,auVar91._0_16_);
      auVar96._0_16_ = vminss_avx512f(auVar93._0_16_,auVar42);
    } while (auVar96._0_4_ < auVar48._0_4_);
    auVar50 = vmaxss_avx512f(auVar53,ZEXT416((uint)(auVar48._0_4_ + -0.1)));
    auVar55 = vminss_avx512f(ZEXT416((uint)(auVar96._0_4_ + 0.1)),auVar42);
    auVar131._0_8_ = auVar142._0_8_;
    auVar131._8_8_ = auVar131._0_8_;
    auVar205._8_8_ = auVar171._0_8_;
    auVar205._0_8_ = auVar171._0_8_;
    auVar221._8_8_ = auVar56._0_8_;
    auVar221._0_8_ = auVar56._0_8_;
    auVar48 = vshufpd_avx(auVar171,auVar171,3);
    auVar41 = vshufpd_avx(auVar56,auVar56,3);
    auVar40 = vshufps_avx(auVar50,auVar55,0);
    auVar54 = vsubps_avx512vl(auVar39,auVar40);
    fVar202 = auVar40._0_4_;
    auVar160._0_4_ = fVar202 * auVar57._0_4_;
    fVar213 = auVar40._4_4_;
    auVar160._4_4_ = fVar213 * auVar57._4_4_;
    fVar215 = auVar40._8_4_;
    auVar160._8_4_ = fVar215 * auVar57._8_4_;
    fVar214 = auVar40._12_4_;
    auVar160._12_4_ = fVar214 * auVar57._12_4_;
    auVar172._0_4_ = fVar202 * auVar48._0_4_;
    auVar172._4_4_ = fVar213 * auVar48._4_4_;
    auVar172._8_4_ = fVar215 * auVar48._8_4_;
    auVar172._12_4_ = fVar214 * auVar48._12_4_;
    auVar238._0_4_ = auVar41._0_4_ * fVar202;
    auVar238._4_4_ = auVar41._4_4_ * fVar213;
    auVar238._8_4_ = auVar41._8_4_ * fVar215;
    auVar238._12_4_ = auVar41._12_4_ * fVar214;
    auVar148._0_4_ = fVar202 * auVar61._0_4_;
    auVar148._4_4_ = fVar213 * auVar61._4_4_;
    auVar148._8_4_ = fVar215 * auVar61._8_4_;
    auVar148._12_4_ = fVar214 * auVar61._12_4_;
    auVar57 = vfmadd231ps_fma(auVar160,auVar54,auVar131);
    auVar61 = vfmadd231ps_fma(auVar172,auVar54,auVar205);
    auVar53 = vfmadd231ps_fma(auVar238,auVar54,auVar221);
    auVar54 = vfmadd231ps_fma(auVar148,auVar54,ZEXT816(0));
    auVar41 = vsubss_avx512f(auVar42,auVar50);
    auVar48 = vmovshdup_avx(auVar112);
    auVar142 = vfmadd231ss_fma(ZEXT416((uint)(auVar48._0_4_ * auVar50._0_4_)),auVar112,auVar41);
    auVar41 = vsubss_avx512f(auVar42,auVar55);
    auVar51 = vfmadd231ss_fma(ZEXT416((uint)(auVar48._0_4_ * auVar55._0_4_)),auVar112,auVar41);
    auVar56 = vdivss_avx512f(auVar42,ZEXT416((uint)fVar217));
    auVar48 = vsubps_avx(auVar61,auVar57);
    auVar55 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar40 = vmulps_avx512vl(auVar48,auVar55);
    auVar48 = vsubps_avx(auVar53,auVar61);
    auVar50 = vmulps_avx512vl(auVar48,auVar55);
    auVar48 = vsubps_avx(auVar54,auVar53);
    auVar48 = vmulps_avx512vl(auVar48,auVar55);
    auVar41 = vminps_avx(auVar50,auVar48);
    auVar48 = vmaxps_avx(auVar50,auVar48);
    auVar41 = vminps_avx(auVar40,auVar41);
    auVar48 = vmaxps_avx(auVar40,auVar48);
    auVar40 = vshufpd_avx(auVar41,auVar41,3);
    auVar50 = vshufpd_avx(auVar48,auVar48,3);
    auVar41 = vminps_avx(auVar41,auVar40);
    auVar48 = vmaxps_avx(auVar48,auVar50);
    fVar217 = auVar56._0_4_;
    auVar191._0_4_ = auVar41._0_4_ * fVar217;
    auVar191._4_4_ = auVar41._4_4_ * fVar217;
    auVar191._8_4_ = auVar41._8_4_ * fVar217;
    auVar191._12_4_ = auVar41._12_4_ * fVar217;
    auVar179._0_4_ = fVar217 * auVar48._0_4_;
    auVar179._4_4_ = fVar217 * auVar48._4_4_;
    auVar179._8_4_ = fVar217 * auVar48._8_4_;
    auVar179._12_4_ = fVar217 * auVar48._12_4_;
    auVar56 = vdivss_avx512f(auVar42,ZEXT416((uint)(auVar51._0_4_ - auVar142._0_4_)));
    auVar48 = vshufpd_avx(auVar57,auVar57,3);
    auVar41 = vshufpd_avx(auVar61,auVar61,3);
    auVar40 = vshufpd_avx(auVar53,auVar53,3);
    auVar50 = vshufpd_avx(auVar54,auVar54,3);
    auVar48 = vsubps_avx(auVar48,auVar57);
    auVar57 = vsubps_avx(auVar41,auVar61);
    auVar61 = vsubps_avx(auVar40,auVar53);
    auVar50 = vsubps_avx(auVar50,auVar54);
    auVar41 = vminps_avx(auVar48,auVar57);
    auVar48 = vmaxps_avx(auVar48,auVar57);
    auVar40 = vminps_avx(auVar61,auVar50);
    auVar40 = vminps_avx(auVar41,auVar40);
    auVar41 = vmaxps_avx(auVar61,auVar50);
    auVar48 = vmaxps_avx(auVar48,auVar41);
    fVar217 = auVar56._0_4_;
    auVar222._0_4_ = fVar217 * auVar40._0_4_;
    auVar222._4_4_ = fVar217 * auVar40._4_4_;
    auVar222._8_4_ = fVar217 * auVar40._8_4_;
    auVar222._12_4_ = fVar217 * auVar40._12_4_;
    auVar206._0_4_ = fVar217 * auVar48._0_4_;
    auVar206._4_4_ = fVar217 * auVar48._4_4_;
    auVar206._8_4_ = fVar217 * auVar48._8_4_;
    auVar206._12_4_ = fVar217 * auVar48._12_4_;
    auVar50 = vinsertps_avx(auVar36,auVar142,0x10);
    auVar52 = vpermt2ps_avx512vl(auVar36,_DAT_01feecd0,auVar51);
    auVar113._0_4_ = auVar50._0_4_ + auVar52._0_4_;
    auVar113._4_4_ = auVar50._4_4_ + auVar52._4_4_;
    auVar113._8_4_ = auVar50._8_4_ + auVar52._8_4_;
    auVar113._12_4_ = auVar50._12_4_ + auVar52._12_4_;
    auVar56 = vmulps_avx512vl(auVar113,auVar105._0_16_);
    auVar41 = vshufps_avx(auVar56,auVar56,0x54);
    uVar107 = auVar56._0_4_;
    auVar119._4_4_ = uVar107;
    auVar119._0_4_ = uVar107;
    auVar119._8_4_ = uVar107;
    auVar119._12_4_ = uVar107;
    auVar40 = vfmadd213ps_fma(local_470,auVar119,auVar38);
    auVar57 = vfmadd213ps_fma(local_480,auVar119,auVar47);
    auVar61 = vfmadd213ps_fma(local_490,auVar119,auVar9);
    auVar48 = vsubps_avx(auVar57,auVar40);
    auVar40 = vfmadd213ps_fma(auVar48,auVar119,auVar40);
    auVar48 = vsubps_avx(auVar61,auVar57);
    auVar48 = vfmadd213ps_fma(auVar48,auVar119,auVar57);
    auVar48 = vsubps_avx(auVar48,auVar40);
    auVar40 = vfmadd231ps_fma(auVar40,auVar48,auVar119);
    auVar53 = vmulps_avx512vl(auVar48,auVar55);
    auVar230._8_8_ = auVar40._0_8_;
    auVar230._0_8_ = auVar40._0_8_;
    auVar48 = vshufpd_avx(auVar40,auVar40,3);
    auVar40 = vshufps_avx(auVar56,auVar56,0x55);
    auVar57 = vsubps_avx(auVar48,auVar230);
    auVar61 = vfmadd231ps_fma(auVar230,auVar40,auVar57);
    auVar239._8_8_ = auVar53._0_8_;
    auVar239._0_8_ = auVar53._0_8_;
    auVar48 = vshufpd_avx(auVar53,auVar53,3);
    auVar48 = vsubps_avx512vl(auVar48,auVar239);
    auVar48 = vfmadd213ps_avx512vl(auVar48,auVar40,auVar239);
    auVar40 = vxorps_avx512vl(auVar57,auVar249._0_16_);
    auVar53 = vmovshdup_avx512vl(auVar48);
    auVar54 = vxorps_avx512vl(auVar53,auVar249._0_16_);
    auVar55 = vmovshdup_avx512vl(auVar57);
    auVar54 = vpermt2ps_avx512vl(auVar54,ZEXT416(5),auVar57);
    auVar57 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar53._0_4_ * auVar57._0_4_)),auVar48,auVar55);
    auVar40 = vpermt2ps_avx512vl(auVar48,SUB6416(ZEXT464(4),0),auVar40);
    auVar149._0_4_ = auVar57._0_4_;
    auVar149._4_4_ = auVar149._0_4_;
    auVar149._8_4_ = auVar149._0_4_;
    auVar149._12_4_ = auVar149._0_4_;
    auVar48 = vdivps_avx(auVar54,auVar149);
    auVar58 = vdivps_avx512vl(auVar40,auVar149);
    fVar217 = auVar61._0_4_;
    auVar40 = vshufps_avx(auVar61,auVar61,0x55);
    auVar231._0_4_ = fVar217 * auVar48._0_4_ + auVar40._0_4_ * auVar58._0_4_;
    auVar231._4_4_ = fVar217 * auVar48._4_4_ + auVar40._4_4_ * auVar58._4_4_;
    auVar231._8_4_ = fVar217 * auVar48._8_4_ + auVar40._8_4_ * auVar58._8_4_;
    auVar231._12_4_ = fVar217 * auVar48._12_4_ + auVar40._12_4_ * auVar58._12_4_;
    auVar55 = vsubps_avx(auVar41,auVar231);
    auVar40 = vmovshdup_avx(auVar48);
    auVar41 = vinsertps_avx(auVar191,auVar222,0x1c);
    auVar240._0_4_ = auVar40._0_4_ * auVar41._0_4_;
    auVar240._4_4_ = auVar40._4_4_ * auVar41._4_4_;
    auVar240._8_4_ = auVar40._8_4_ * auVar41._8_4_;
    auVar240._12_4_ = auVar40._12_4_ * auVar41._12_4_;
    auVar60 = vinsertps_avx512f(auVar179,auVar206,0x1c);
    auVar40 = vmulps_avx512vl(auVar40,auVar60);
    auVar54 = vminps_avx512vl(auVar240,auVar40);
    auVar61 = vmaxps_avx(auVar40,auVar240);
    auVar53 = vmovshdup_avx(auVar58);
    auVar40 = vinsertps_avx(auVar222,auVar191,0x4c);
    auVar223._0_4_ = auVar53._0_4_ * auVar40._0_4_;
    auVar223._4_4_ = auVar53._4_4_ * auVar40._4_4_;
    auVar223._8_4_ = auVar53._8_4_ * auVar40._8_4_;
    auVar223._12_4_ = auVar53._12_4_ * auVar40._12_4_;
    auVar57 = vinsertps_avx(auVar206,auVar179,0x4c);
    auVar207._0_4_ = auVar53._0_4_ * auVar57._0_4_;
    auVar207._4_4_ = auVar53._4_4_ * auVar57._4_4_;
    auVar207._8_4_ = auVar53._8_4_ * auVar57._8_4_;
    auVar207._12_4_ = auVar53._12_4_ * auVar57._12_4_;
    auVar53 = vminps_avx(auVar223,auVar207);
    auVar54 = vaddps_avx512vl(auVar54,auVar53);
    auVar53 = vmaxps_avx(auVar207,auVar223);
    auVar208._0_4_ = auVar61._0_4_ + auVar53._0_4_;
    auVar208._4_4_ = auVar61._4_4_ + auVar53._4_4_;
    auVar208._8_4_ = auVar61._8_4_ + auVar53._8_4_;
    auVar208._12_4_ = auVar61._12_4_ + auVar53._12_4_;
    auVar224._8_8_ = 0x3f80000000000000;
    auVar224._0_8_ = 0x3f80000000000000;
    auVar61 = vsubps_avx(auVar224,auVar208);
    auVar53 = vsubps_avx(auVar224,auVar54);
    auVar54 = vsubps_avx(auVar50,auVar56);
    auVar56 = vsubps_avx(auVar52,auVar56);
    fVar214 = auVar54._0_4_;
    auVar241._0_4_ = fVar214 * auVar61._0_4_;
    fVar216 = auVar54._4_4_;
    auVar241._4_4_ = fVar216 * auVar61._4_4_;
    fVar218 = auVar54._8_4_;
    auVar241._8_4_ = fVar218 * auVar61._8_4_;
    fVar226 = auVar54._12_4_;
    auVar241._12_4_ = fVar226 * auVar61._12_4_;
    auVar59 = vbroadcastss_avx512vl(auVar48);
    auVar41 = vmulps_avx512vl(auVar59,auVar41);
    auVar60 = vmulps_avx512vl(auVar59,auVar60);
    auVar59 = vminps_avx512vl(auVar41,auVar60);
    auVar60 = vmaxps_avx512vl(auVar60,auVar41);
    auVar41 = vbroadcastss_avx512vl(auVar58);
    auVar40 = vmulps_avx512vl(auVar41,auVar40);
    auVar41 = vmulps_avx512vl(auVar41,auVar57);
    auVar57 = vminps_avx512vl(auVar40,auVar41);
    auVar57 = vaddps_avx512vl(auVar59,auVar57);
    auVar54 = vmulps_avx512vl(auVar54,auVar53);
    fVar217 = auVar56._0_4_;
    auVar209._0_4_ = fVar217 * auVar61._0_4_;
    fVar202 = auVar56._4_4_;
    auVar209._4_4_ = fVar202 * auVar61._4_4_;
    fVar213 = auVar56._8_4_;
    auVar209._8_4_ = fVar213 * auVar61._8_4_;
    fVar215 = auVar56._12_4_;
    auVar209._12_4_ = fVar215 * auVar61._12_4_;
    auVar225._0_4_ = fVar217 * auVar53._0_4_;
    auVar225._4_4_ = fVar202 * auVar53._4_4_;
    auVar225._8_4_ = fVar213 * auVar53._8_4_;
    auVar225._12_4_ = fVar215 * auVar53._12_4_;
    auVar41 = vmaxps_avx(auVar41,auVar40);
    auVar180._0_4_ = auVar60._0_4_ + auVar41._0_4_;
    auVar180._4_4_ = auVar60._4_4_ + auVar41._4_4_;
    auVar180._8_4_ = auVar60._8_4_ + auVar41._8_4_;
    auVar180._12_4_ = auVar60._12_4_ + auVar41._12_4_;
    auVar192._8_8_ = 0x3f800000;
    auVar192._0_8_ = 0x3f800000;
    auVar41 = vsubps_avx(auVar192,auVar180);
    auVar40 = vsubps_avx512vl(auVar192,auVar57);
    auVar236._0_4_ = fVar214 * auVar41._0_4_;
    auVar236._4_4_ = fVar216 * auVar41._4_4_;
    auVar236._8_4_ = fVar218 * auVar41._8_4_;
    auVar236._12_4_ = fVar226 * auVar41._12_4_;
    auVar232._0_4_ = fVar214 * auVar40._0_4_;
    auVar232._4_4_ = fVar216 * auVar40._4_4_;
    auVar232._8_4_ = fVar218 * auVar40._8_4_;
    auVar232._12_4_ = fVar226 * auVar40._12_4_;
    auVar181._0_4_ = fVar217 * auVar41._0_4_;
    auVar181._4_4_ = fVar202 * auVar41._4_4_;
    auVar181._8_4_ = fVar213 * auVar41._8_4_;
    auVar181._12_4_ = fVar215 * auVar41._12_4_;
    auVar193._0_4_ = fVar217 * auVar40._0_4_;
    auVar193._4_4_ = fVar202 * auVar40._4_4_;
    auVar193._8_4_ = fVar213 * auVar40._8_4_;
    auVar193._12_4_ = fVar215 * auVar40._12_4_;
    auVar41 = vminps_avx(auVar236,auVar232);
    auVar40 = vminps_avx512vl(auVar181,auVar193);
    auVar57 = vminps_avx512vl(auVar41,auVar40);
    auVar41 = vmaxps_avx(auVar232,auVar236);
    auVar40 = vmaxps_avx(auVar193,auVar181);
    auVar40 = vmaxps_avx(auVar40,auVar41);
    auVar61 = vminps_avx512vl(auVar241,auVar54);
    auVar41 = vminps_avx(auVar209,auVar225);
    auVar41 = vminps_avx(auVar61,auVar41);
    auVar41 = vhaddps_avx(auVar57,auVar41);
    auVar61 = vmaxps_avx512vl(auVar54,auVar241);
    auVar57 = vmaxps_avx(auVar225,auVar209);
    auVar57 = vmaxps_avx(auVar57,auVar61);
    auVar40 = vhaddps_avx(auVar40,auVar57);
    auVar41 = vshufps_avx(auVar41,auVar41,0xe8);
    auVar40 = vshufps_avx(auVar40,auVar40,0xe8);
    auVar182._0_4_ = auVar41._0_4_ + auVar55._0_4_;
    auVar182._4_4_ = auVar41._4_4_ + auVar55._4_4_;
    auVar182._8_4_ = auVar41._8_4_ + auVar55._8_4_;
    auVar182._12_4_ = auVar41._12_4_ + auVar55._12_4_;
    auVar194._0_4_ = auVar40._0_4_ + auVar55._0_4_;
    auVar194._4_4_ = auVar40._4_4_ + auVar55._4_4_;
    auVar194._8_4_ = auVar40._8_4_ + auVar55._8_4_;
    auVar194._12_4_ = auVar40._12_4_ + auVar55._12_4_;
    auVar41 = vmaxps_avx(auVar50,auVar182);
    auVar40 = vminps_avx(auVar194,auVar52);
    uVar27 = vcmpps_avx512vl(auVar40,auVar41,1);
    auVar41 = ZEXT416(5);
    if ((uVar27 & 3) != 0) {
      auVar96._0_16_ = vxorps_avx512vl(ZEXT416(5),auVar41);
      auVar247 = ZEXT1664(auVar96._0_16_);
      goto LAB_01aeae78;
    }
    uVar27 = vcmpps_avx512vl(auVar194,auVar52,1);
    uVar11 = vcmpps_avx512vl(auVar36,auVar182,1);
    if (((ushort)uVar11 & (ushort)uVar27 & 1) == 0) {
      bVar24 = 0;
    }
    else {
      auVar40 = vmovshdup_avx(auVar182);
      bVar24 = auVar142._0_4_ < auVar40._0_4_ & (byte)(uVar27 >> 1) & 0x7f;
    }
    auVar95._0_16_ = vxorps_avx512vl(auVar41,auVar41);
    auVar95._16_48_ = auVar96._16_48_;
    auVar247 = ZEXT1664(auVar95._0_16_);
    local_630 = auVar46._0_4_;
    fStack_62c = auVar46._4_4_;
    fStack_628 = auVar46._8_4_;
    fStack_624 = auVar46._12_4_;
    if (((!bVar30 || uVar4 != 0 && !bVar32) | bVar24) == 1) {
      lVar23 = 200;
      auVar96 = auVar95;
      do {
        auVar36 = vsubss_avx512f(auVar42,auVar55);
        fVar213 = auVar36._0_4_;
        fVar217 = fVar213 * fVar213 * fVar213;
        fVar215 = auVar55._0_4_;
        fVar202 = fVar215 * 3.0 * fVar213 * fVar213;
        fVar213 = fVar213 * fVar215 * fVar215 * 3.0;
        auVar136._4_4_ = fVar217;
        auVar136._0_4_ = fVar217;
        auVar136._8_4_ = fVar217;
        auVar136._12_4_ = fVar217;
        auVar132._4_4_ = fVar202;
        auVar132._0_4_ = fVar202;
        auVar132._8_4_ = fVar202;
        auVar132._12_4_ = fVar202;
        auVar102._4_4_ = fVar213;
        auVar102._0_4_ = fVar213;
        auVar102._8_4_ = fVar213;
        auVar102._12_4_ = fVar213;
        fVar215 = fVar215 * fVar215 * fVar215;
        auVar161._0_4_ = local_630 * fVar215;
        auVar161._4_4_ = fStack_62c * fVar215;
        auVar161._8_4_ = fStack_628 * fVar215;
        auVar161._12_4_ = fStack_624 * fVar215;
        auVar36 = vfmadd231ps_fma(auVar161,auVar9,auVar102);
        auVar36 = vfmadd231ps_fma(auVar36,auVar47,auVar132);
        auVar36 = vfmadd231ps_fma(auVar36,auVar38,auVar136);
        auVar103._8_8_ = auVar36._0_8_;
        auVar103._0_8_ = auVar36._0_8_;
        auVar36 = vshufpd_avx(auVar36,auVar36,3);
        auVar41 = vshufps_avx(auVar55,auVar55,0x55);
        auVar36 = vsubps_avx(auVar36,auVar103);
        auVar41 = vfmadd213ps_fma(auVar36,auVar41,auVar103);
        fVar217 = auVar41._0_4_;
        auVar36 = vshufps_avx(auVar41,auVar41,0x55);
        auVar104._0_4_ = auVar48._0_4_ * fVar217 + auVar58._0_4_ * auVar36._0_4_;
        auVar104._4_4_ = auVar48._4_4_ * fVar217 + auVar58._4_4_ * auVar36._4_4_;
        auVar104._8_4_ = auVar48._8_4_ * fVar217 + auVar58._8_4_ * auVar36._8_4_;
        auVar104._12_4_ = auVar48._12_4_ * fVar217 + auVar58._12_4_ * auVar36._12_4_;
        auVar55 = vsubps_avx(auVar55,auVar104);
        auVar36 = vandps_avx512vl(auVar41,auVar245._0_16_);
        auVar96._0_16_ = vprolq_avx512vl(auVar36,0x20);
        auVar36 = vmaxss_avx(auVar96._0_16_,auVar36);
        bVar32 = auVar36._0_4_ <= fVar106;
        if (auVar36._0_4_ < fVar106) {
          auVar36 = vucomiss_avx512f(auVar95._0_16_);
          if (bVar32) {
            auVar48 = vucomiss_avx512f(auVar36);
            auVar248 = ZEXT1664(auVar48);
            if (bVar32) {
              vmovshdup_avx(auVar36);
              auVar48 = vucomiss_avx512f(auVar95._0_16_);
              if (bVar32) {
                auVar41 = vucomiss_avx512f(auVar48);
                auVar248 = ZEXT1664(auVar41);
                if (bVar32) {
                  auVar40 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
                  auVar56 = vinsertps_avx(auVar40,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]
                                                         ),0x28);
                  auVar40 = vdpps_avx(auVar56,local_4a0,0x7f);
                  auVar42 = vdpps_avx(auVar56,local_4b0,0x7f);
                  auVar50 = vdpps_avx(auVar56,local_4c0,0x7f);
                  auVar57 = vdpps_avx(auVar56,local_4d0,0x7f);
                  auVar61 = vdpps_avx(auVar56,local_4e0,0x7f);
                  auVar53 = vdpps_avx(auVar56,local_4f0,0x7f);
                  auVar54 = vdpps_avx(auVar56,local_500,0x7f);
                  auVar56 = vdpps_avx(auVar56,local_510,0x7f);
                  auVar55 = vsubss_avx512f(auVar41,auVar48);
                  fVar217 = auVar48._0_4_;
                  auVar48 = vfmadd231ss_fma(ZEXT416((uint)(fVar217 * auVar61._0_4_)),auVar55,auVar40
                                           );
                  auVar40 = vfmadd231ss_fma(ZEXT416((uint)(auVar53._0_4_ * fVar217)),auVar55,auVar42
                                           );
                  auVar42 = vfmadd231ss_fma(ZEXT416((uint)(auVar54._0_4_ * fVar217)),auVar55,auVar50
                                           );
                  auVar50 = vfmadd231ss_fma(ZEXT416((uint)(fVar217 * auVar56._0_4_)),auVar55,auVar57
                                           );
                  auVar96._0_16_ = vsubss_avx512f(auVar41,auVar36);
                  auVar162._0_4_ = auVar96._0_4_;
                  fVar217 = auVar162._0_4_ * auVar162._0_4_ * auVar162._0_4_;
                  fVar214 = auVar36._0_4_;
                  fVar202 = fVar214 * 3.0 * auVar162._0_4_ * auVar162._0_4_;
                  fVar213 = auVar162._0_4_ * fVar214 * fVar214 * 3.0;
                  fVar216 = fVar214 * fVar214 * fVar214;
                  auVar41 = vfmadd231ss_fma(ZEXT416((uint)(fVar216 * auVar50._0_4_)),
                                            ZEXT416((uint)fVar213),auVar42);
                  auVar41 = vfmadd231ss_fma(auVar41,ZEXT416((uint)fVar202),auVar40);
                  auVar48 = vfmadd231ss_fma(auVar41,ZEXT416((uint)fVar217),auVar48);
                  fVar215 = auVar48._0_4_;
                  if ((fVar98 <= fVar215) &&
                     (fVar218 = *(float *)(ray + k * 4 + 0x200), fVar215 <= fVar218)) {
                    auVar48 = vshufps_avx(auVar36,auVar36,0x55);
                    auVar40 = vsubps_avx512vl(auVar39,auVar48);
                    fVar226 = auVar48._0_4_;
                    auVar195._0_4_ = fVar226 * (float)local_530._0_4_;
                    fVar227 = auVar48._4_4_;
                    auVar195._4_4_ = fVar227 * (float)local_530._4_4_;
                    fVar228 = auVar48._8_4_;
                    auVar195._8_4_ = fVar228 * fStack_528;
                    fVar176 = auVar48._12_4_;
                    auVar195._12_4_ = fVar176 * fStack_524;
                    auVar199._0_4_ = fVar226 * (float)local_580._0_4_;
                    auVar199._4_4_ = fVar227 * (float)local_580._4_4_;
                    auVar199._8_4_ = fVar228 * fStack_578;
                    auVar199._12_4_ = fVar176 * fStack_574;
                    auVar210._0_4_ = fVar226 * (float)local_590._0_4_;
                    auVar210._4_4_ = fVar227 * (float)local_590._4_4_;
                    auVar210._8_4_ = fVar228 * fStack_588;
                    auVar210._12_4_ = fVar176 * fStack_584;
                    auVar173._0_4_ = fVar226 * (float)local_550._0_4_;
                    auVar173._4_4_ = fVar227 * (float)local_550._4_4_;
                    auVar173._8_4_ = fVar228 * fStack_548;
                    auVar173._12_4_ = fVar176 * fStack_544;
                    auVar48 = vfmadd231ps_fma(auVar195,auVar40,local_520);
                    auVar41 = vfmadd231ps_fma(auVar199,auVar40,local_560);
                    auVar39 = vfmadd231ps_fma(auVar210,auVar40,local_570);
                    auVar40 = vfmadd231ps_fma(auVar173,auVar40,local_540);
                    auVar48 = vsubps_avx(auVar41,auVar48);
                    auVar41 = vsubps_avx(auVar39,auVar41);
                    auVar39 = vsubps_avx(auVar40,auVar39);
                    auVar211._0_4_ = fVar214 * auVar41._0_4_;
                    auVar211._4_4_ = fVar214 * auVar41._4_4_;
                    auVar211._8_4_ = fVar214 * auVar41._8_4_;
                    auVar211._12_4_ = fVar214 * auVar41._12_4_;
                    auVar162._4_4_ = auVar162._0_4_;
                    auVar162._8_4_ = auVar162._0_4_;
                    auVar162._12_4_ = auVar162._0_4_;
                    auVar48 = vfmadd231ps_fma(auVar211,auVar162,auVar48);
                    auVar174._0_4_ = fVar214 * auVar39._0_4_;
                    auVar174._4_4_ = fVar214 * auVar39._4_4_;
                    auVar174._8_4_ = fVar214 * auVar39._8_4_;
                    auVar174._12_4_ = fVar214 * auVar39._12_4_;
                    auVar41 = vfmadd231ps_fma(auVar174,auVar162,auVar41);
                    auVar175._0_4_ = fVar214 * auVar41._0_4_;
                    auVar175._4_4_ = fVar214 * auVar41._4_4_;
                    auVar175._8_4_ = fVar214 * auVar41._8_4_;
                    auVar175._12_4_ = fVar214 * auVar41._12_4_;
                    auVar48 = vfmadd231ps_fma(auVar175,auVar162,auVar48);
                    auVar15._8_4_ = 0x40400000;
                    auVar15._0_8_ = 0x4040000040400000;
                    auVar15._12_4_ = 0x40400000;
                    auVar96._0_16_ = vmulps_avx512vl(auVar48,auVar15);
                    pGVar5 = (context->scene->geometries).items[uVar28].ptr;
                    if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
LAB_01aebcce:
                      bVar24 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar24 = 1, pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar150._0_4_ = fVar216 * (float)local_5e0._0_4_;
                      auVar150._4_4_ = fVar216 * (float)local_5e0._4_4_;
                      auVar150._8_4_ = fVar216 * fStack_5d8;
                      auVar150._12_4_ = fVar216 * fStack_5d4;
                      auVar137._4_4_ = fVar213;
                      auVar137._0_4_ = fVar213;
                      auVar137._8_4_ = fVar213;
                      auVar137._12_4_ = fVar213;
                      auVar48 = vfmadd132ps_fma(auVar137,auVar150,local_5d0);
                      auVar133._4_4_ = fVar202;
                      auVar133._0_4_ = fVar202;
                      auVar133._8_4_ = fVar202;
                      auVar133._12_4_ = fVar202;
                      auVar48 = vfmadd132ps_fma(auVar133,auVar48,local_5c0);
                      auVar120._4_4_ = fVar217;
                      auVar120._0_4_ = fVar217;
                      auVar120._8_4_ = fVar217;
                      auVar120._12_4_ = fVar217;
                      auVar39 = vfmadd132ps_fma(auVar120,auVar48,local_5b0);
                      auVar48 = vshufps_avx(auVar39,auVar39,0xc9);
                      auVar41 = vshufps_avx(auVar96._0_16_,auVar96._0_16_,0xc9);
                      auVar121._0_4_ = auVar39._0_4_ * auVar41._0_4_;
                      auVar121._4_4_ = auVar39._4_4_ * auVar41._4_4_;
                      auVar121._8_4_ = auVar39._8_4_ * auVar41._8_4_;
                      auVar121._12_4_ = auVar39._12_4_ * auVar41._12_4_;
                      auVar48 = vfmsub231ps_fma(auVar121,auVar96._0_16_,auVar48);
                      local_200 = vbroadcastss_avx512f(auVar36);
                      auVar245 = vbroadcastss_avx512f(ZEXT416(1));
                      local_1c0 = vpermps_avx512f(auVar245,ZEXT1664(auVar36));
                      auVar245 = vpermps_avx512f(auVar245,ZEXT1664(auVar48));
                      auVar105 = vbroadcastss_avx512f(ZEXT416(2));
                      local_280 = vpermps_avx512f(auVar105,ZEXT1664(auVar48));
                      local_240 = vbroadcastss_avx512f(auVar48);
                      local_2c0[0] = (RTCHitN)auVar245[0];
                      local_2c0[1] = (RTCHitN)auVar245[1];
                      local_2c0[2] = (RTCHitN)auVar245[2];
                      local_2c0[3] = (RTCHitN)auVar245[3];
                      local_2c0[4] = (RTCHitN)auVar245[4];
                      local_2c0[5] = (RTCHitN)auVar245[5];
                      local_2c0[6] = (RTCHitN)auVar245[6];
                      local_2c0[7] = (RTCHitN)auVar245[7];
                      local_2c0[8] = (RTCHitN)auVar245[8];
                      local_2c0[9] = (RTCHitN)auVar245[9];
                      local_2c0[10] = (RTCHitN)auVar245[10];
                      local_2c0[0xb] = (RTCHitN)auVar245[0xb];
                      local_2c0[0xc] = (RTCHitN)auVar245[0xc];
                      local_2c0[0xd] = (RTCHitN)auVar245[0xd];
                      local_2c0[0xe] = (RTCHitN)auVar245[0xe];
                      local_2c0[0xf] = (RTCHitN)auVar245[0xf];
                      local_2c0[0x10] = (RTCHitN)auVar245[0x10];
                      local_2c0[0x11] = (RTCHitN)auVar245[0x11];
                      local_2c0[0x12] = (RTCHitN)auVar245[0x12];
                      local_2c0[0x13] = (RTCHitN)auVar245[0x13];
                      local_2c0[0x14] = (RTCHitN)auVar245[0x14];
                      local_2c0[0x15] = (RTCHitN)auVar245[0x15];
                      local_2c0[0x16] = (RTCHitN)auVar245[0x16];
                      local_2c0[0x17] = (RTCHitN)auVar245[0x17];
                      local_2c0[0x18] = (RTCHitN)auVar245[0x18];
                      local_2c0[0x19] = (RTCHitN)auVar245[0x19];
                      local_2c0[0x1a] = (RTCHitN)auVar245[0x1a];
                      local_2c0[0x1b] = (RTCHitN)auVar245[0x1b];
                      local_2c0[0x1c] = (RTCHitN)auVar245[0x1c];
                      local_2c0[0x1d] = (RTCHitN)auVar245[0x1d];
                      local_2c0[0x1e] = (RTCHitN)auVar245[0x1e];
                      local_2c0[0x1f] = (RTCHitN)auVar245[0x1f];
                      local_2c0[0x20] = (RTCHitN)auVar245[0x20];
                      local_2c0[0x21] = (RTCHitN)auVar245[0x21];
                      local_2c0[0x22] = (RTCHitN)auVar245[0x22];
                      local_2c0[0x23] = (RTCHitN)auVar245[0x23];
                      local_2c0[0x24] = (RTCHitN)auVar245[0x24];
                      local_2c0[0x25] = (RTCHitN)auVar245[0x25];
                      local_2c0[0x26] = (RTCHitN)auVar245[0x26];
                      local_2c0[0x27] = (RTCHitN)auVar245[0x27];
                      local_2c0[0x28] = (RTCHitN)auVar245[0x28];
                      local_2c0[0x29] = (RTCHitN)auVar245[0x29];
                      local_2c0[0x2a] = (RTCHitN)auVar245[0x2a];
                      local_2c0[0x2b] = (RTCHitN)auVar245[0x2b];
                      local_2c0[0x2c] = (RTCHitN)auVar245[0x2c];
                      local_2c0[0x2d] = (RTCHitN)auVar245[0x2d];
                      local_2c0[0x2e] = (RTCHitN)auVar245[0x2e];
                      local_2c0[0x2f] = (RTCHitN)auVar245[0x2f];
                      local_2c0[0x30] = (RTCHitN)auVar245[0x30];
                      local_2c0[0x31] = (RTCHitN)auVar245[0x31];
                      local_2c0[0x32] = (RTCHitN)auVar245[0x32];
                      local_2c0[0x33] = (RTCHitN)auVar245[0x33];
                      local_2c0[0x34] = (RTCHitN)auVar245[0x34];
                      local_2c0[0x35] = (RTCHitN)auVar245[0x35];
                      local_2c0[0x36] = (RTCHitN)auVar245[0x36];
                      local_2c0[0x37] = (RTCHitN)auVar245[0x37];
                      local_2c0[0x38] = (RTCHitN)auVar245[0x38];
                      local_2c0[0x39] = (RTCHitN)auVar245[0x39];
                      local_2c0[0x3a] = (RTCHitN)auVar245[0x3a];
                      local_2c0[0x3b] = (RTCHitN)auVar245[0x3b];
                      local_2c0[0x3c] = (RTCHitN)auVar245[0x3c];
                      local_2c0[0x3d] = (RTCHitN)auVar245[0x3d];
                      local_2c0[0x3e] = (RTCHitN)auVar245[0x3e];
                      local_2c0[0x3f] = (RTCHitN)auVar245[0x3f];
                      local_180 = local_300._0_8_;
                      uStack_178 = local_300._8_8_;
                      uStack_170 = local_300._16_8_;
                      uStack_168 = local_300._24_8_;
                      uStack_160 = local_300._32_8_;
                      uStack_158 = local_300._40_8_;
                      uStack_150 = local_300._48_8_;
                      uStack_148 = local_300._56_8_;
                      auVar245 = vmovdqa64_avx512f(local_340);
                      local_140 = vmovdqa64_avx512f(auVar245);
                      vpcmpeqd_avx2(auVar245._0_32_,auVar245._0_32_);
                      local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                      local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                      *(float *)(ray + k * 4 + 0x200) = fVar215;
                      auVar96 = vmovdqa64_avx512f(local_380);
                      local_440 = vmovdqa64_avx512f(auVar96);
                      local_610.valid = (int *)local_440;
                      local_610.geometryUserPtr = pGVar5->userPtr;
                      local_610.context = context->user;
                      local_610.ray = (RTCRayN *)ray;
                      local_610.hit = local_2c0;
                      local_610.N = 0x10;
                      if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar5->occlusionFilterN)(&local_610);
                        auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar249 = ZEXT1664(auVar36);
                        auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar246 = ZEXT1664(auVar36);
                        auVar96 = vmovdqa64_avx512f(local_440);
                      }
                      uVar11 = vptestmd_avx512f(auVar96,auVar96);
                      auVar247._32_32_ = auVar96._32_32_;
                      if ((short)uVar11 == 0) {
                        auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar245 = ZEXT1664(auVar36);
                        auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                        auVar105 = ZEXT1664(auVar36);
                        auVar79 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar242 = ZEXT3264(auVar79);
                        auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                        auVar243 = ZEXT1664(auVar36);
                        auVar247._0_32_ = _DAT_01feed20;
                        auVar244 = ZEXT3264(_DAT_01feed20);
                        auVar96._16_48_ = auVar247._16_48_;
                        auVar96._0_16_ = vxorps_avx512vl(auVar95._0_16_,auVar95._0_16_);
                        auVar247 = ZEXT1664(auVar96._0_16_);
                      }
                      else {
                        p_Var6 = context->args->filter;
                        if (p_Var6 == (RTCFilterFunctionN)0x0) {
                          auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar245 = ZEXT1664(auVar36);
                          auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                          auVar105 = ZEXT1664(auVar36);
                          auVar79 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                          auVar242 = ZEXT3264(auVar79);
                          auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                          auVar243 = ZEXT1664(auVar36);
                          auVar244 = ZEXT3264(_DAT_01feed20);
                          auVar36 = vxorps_avx512vl(auVar95._0_16_,auVar95._0_16_);
                          auVar247 = ZEXT1664(auVar36);
                        }
                        else {
                          auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar245 = ZEXT1664(auVar36);
                          auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                          auVar105 = ZEXT1664(auVar36);
                          auVar79 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                          auVar242 = ZEXT3264(auVar79);
                          auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                          auVar243 = ZEXT1664(auVar36);
                          auVar244 = ZEXT3264(_DAT_01feed20);
                          auVar36 = vxorps_avx512vl(auVar95._0_16_,auVar95._0_16_);
                          auVar247 = ZEXT1664(auVar36);
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar5->field_8).field_0x2 & 0x40) != 0)) {
                            (*p_Var6)(&local_610);
                            auVar36 = vxorps_avx512vl(auVar36,auVar36);
                            auVar247 = ZEXT1664(auVar36);
                            auVar244 = ZEXT3264(_DAT_01feed20);
                            auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                            auVar243 = ZEXT1664(auVar36);
                            auVar79 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                            auVar242 = ZEXT3264(auVar79);
                            auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                            auVar105 = ZEXT1664(auVar36);
                            auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                            auVar249 = ZEXT1664(auVar36);
                            auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar246 = ZEXT1664(auVar36);
                            auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar245 = ZEXT1664(auVar36);
                            auVar96 = vmovdqa64_avx512f(local_440);
                          }
                        }
                        auVar248 = ZEXT464(0x3f800000);
                        uVar27 = vptestmd_avx512f(auVar96,auVar96);
                        auVar97 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                        bVar32 = (bool)((byte)uVar27 & 1);
                        auVar96._0_4_ =
                             (uint)bVar32 * auVar97._0_4_ |
                             (uint)!bVar32 * *(int *)(local_610.ray + 0x200);
                        bVar32 = (bool)((byte)(uVar27 >> 1) & 1);
                        auVar96._4_4_ =
                             (uint)bVar32 * auVar97._4_4_ |
                             (uint)!bVar32 * *(int *)(local_610.ray + 0x204);
                        bVar32 = (bool)((byte)(uVar27 >> 2) & 1);
                        auVar96._8_4_ =
                             (uint)bVar32 * auVar97._8_4_ |
                             (uint)!bVar32 * *(int *)(local_610.ray + 0x208);
                        bVar32 = (bool)((byte)(uVar27 >> 3) & 1);
                        auVar96._12_4_ =
                             (uint)bVar32 * auVar97._12_4_ |
                             (uint)!bVar32 * *(int *)(local_610.ray + 0x20c);
                        bVar32 = (bool)((byte)(uVar27 >> 4) & 1);
                        auVar96._16_4_ =
                             (uint)bVar32 * auVar97._16_4_ |
                             (uint)!bVar32 * *(int *)(local_610.ray + 0x210);
                        bVar32 = (bool)((byte)(uVar27 >> 5) & 1);
                        auVar96._20_4_ =
                             (uint)bVar32 * auVar97._20_4_ |
                             (uint)!bVar32 * *(int *)(local_610.ray + 0x214);
                        bVar32 = (bool)((byte)(uVar27 >> 6) & 1);
                        auVar96._24_4_ =
                             (uint)bVar32 * auVar97._24_4_ |
                             (uint)!bVar32 * *(int *)(local_610.ray + 0x218);
                        bVar32 = (bool)((byte)(uVar27 >> 7) & 1);
                        auVar96._28_4_ =
                             (uint)bVar32 * auVar97._28_4_ |
                             (uint)!bVar32 * *(int *)(local_610.ray + 0x21c);
                        bVar32 = (bool)((byte)(uVar27 >> 8) & 1);
                        auVar96._32_4_ =
                             (uint)bVar32 * auVar97._32_4_ |
                             (uint)!bVar32 * *(int *)(local_610.ray + 0x220);
                        bVar32 = (bool)((byte)(uVar27 >> 9) & 1);
                        auVar96._36_4_ =
                             (uint)bVar32 * auVar97._36_4_ |
                             (uint)!bVar32 * *(int *)(local_610.ray + 0x224);
                        bVar32 = (bool)((byte)(uVar27 >> 10) & 1);
                        auVar96._40_4_ =
                             (uint)bVar32 * auVar97._40_4_ |
                             (uint)!bVar32 * *(int *)(local_610.ray + 0x228);
                        bVar32 = (bool)((byte)(uVar27 >> 0xb) & 1);
                        auVar96._44_4_ =
                             (uint)bVar32 * auVar97._44_4_ |
                             (uint)!bVar32 * *(int *)(local_610.ray + 0x22c);
                        bVar32 = (bool)((byte)(uVar27 >> 0xc) & 1);
                        auVar96._48_4_ =
                             (uint)bVar32 * auVar97._48_4_ |
                             (uint)!bVar32 * *(int *)(local_610.ray + 0x230);
                        bVar32 = (bool)((byte)(uVar27 >> 0xd) & 1);
                        auVar96._52_4_ =
                             (uint)bVar32 * auVar97._52_4_ |
                             (uint)!bVar32 * *(int *)(local_610.ray + 0x234);
                        bVar32 = (bool)((byte)(uVar27 >> 0xe) & 1);
                        auVar96._56_4_ =
                             (uint)bVar32 * auVar97._56_4_ |
                             (uint)!bVar32 * *(int *)(local_610.ray + 0x238);
                        bVar32 = SUB81(uVar27 >> 0xf,0);
                        auVar96._60_4_ =
                             (uint)bVar32 * auVar97._60_4_ |
                             (uint)!bVar32 * *(int *)(local_610.ray + 0x23c);
                        *(undefined1 (*) [64])(local_610.ray + 0x200) = auVar96;
                        bVar24 = 1;
                        if ((short)uVar27 != 0) goto LAB_01aebcd0;
                      }
                      auVar248 = ZEXT464(0x3f800000);
                      *(float *)(ray + k * 4 + 0x200) = fVar218;
                      goto LAB_01aebcce;
                    }
LAB_01aebcd0:
                    bVar29 = (bool)(bVar29 | bVar24);
                  }
                }
              }
            }
          }
          break;
        }
        lVar23 = lVar23 + -1;
      } while (lVar23 != 0);
      goto LAB_01aeae78;
    }
    auVar112 = vinsertps_avx(auVar142,auVar51,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }